

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_avx512::forward_inplace(TanH_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [56];
  undefined1 auVar74 [24];
  undefined1 auVar75 [40];
  undefined1 auVar76 [48];
  undefined1 auVar77 [24];
  long *in_RSI;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  double dVar82;
  float fVar84;
  float fVar85;
  undefined1 auVar83 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 two;
  __m512 one;
  __m256 two_1;
  __m256 one_3;
  __m128 two_2;
  __m128 one_6;
  __m512 one_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one_2;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 one_4;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m128 one_7;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_8;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  int local_2c18;
  undefined8 local_2c08;
  undefined8 local_2c00;
  undefined8 local_2bf8;
  undefined4 local_2bf0;
  long local_2be8;
  undefined4 local_2be0;
  undefined4 local_2bdc;
  undefined4 local_2bd8;
  undefined4 local_2bd4;
  undefined4 local_2bd0;
  undefined8 local_2bc8;
  undefined1 (*local_2bc0) [64];
  int local_2bb4;
  int local_2bb0;
  int local_2bac;
  int local_2ba8;
  int local_2ba4;
  int local_2ba0;
  int local_2b9c;
  long *local_2b90;
  undefined1 local_2b7d;
  int local_2b7c;
  undefined8 *local_2b70;
  undefined8 *local_2b68;
  undefined8 *local_2b58;
  undefined1 (*local_2b48) [64];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined1 (*local_2a10) [64];
  undefined1 (*local_2a08) [64];
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 (*local_2970) [64];
  undefined1 (*local_2968) [64];
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 local_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 local_2930;
  undefined8 uStack_2928;
  undefined1 (*local_2918) [64];
  long local_2910;
  undefined4 local_2904;
  long local_2900;
  undefined1 (*local_28f8) [64];
  undefined4 local_28ec;
  int local_28e8;
  int local_28e4;
  undefined8 *local_28e0;
  undefined4 local_28d4;
  long local_28d0;
  undefined8 *local_28b0;
  undefined1 local_2880 [64];
  undefined4 local_2804;
  undefined1 local_2800 [64];
  undefined4 local_2784;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [64];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined4 local_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [64];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 local_2440 [64];
  undefined1 local_2400 [8];
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  ushort local_2382;
  float local_2380 [2];
  float afStack_2378 [2];
  float afStack_2370 [2];
  float afStack_2368 [2];
  float afStack_2360 [2];
  float afStack_2358 [2];
  float afStack_2350 [2];
  float afStack_2348 [2];
  undefined1 local_2340 [64];
  undefined1 local_2300 [16];
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 uStack_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  float local_2140 [2];
  float afStack_2138 [2];
  float afStack_2130 [2];
  float afStack_2128 [2];
  float afStack_2120 [2];
  float afStack_2118 [2];
  float afStack_2110 [2];
  float afStack_2108 [2];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  float afStack_1fa0 [2];
  float afStack_1f98 [2];
  float afStack_1f90 [2];
  float afStack_1f88 [2];
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  float afStack_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  float local_1d40 [2];
  float afStack_1d38 [2];
  float afStack_1d30 [2];
  float afStack_1d28 [2];
  float afStack_1d20 [2];
  float afStack_1d18 [2];
  float afStack_1d10 [2];
  float afStack_1d08 [2];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80 [2];
  float afStack_1c78 [2];
  float afStack_1c70 [2];
  float afStack_1c68 [2];
  float afStack_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0 [2];
  float afStack_1bb8 [2];
  float afStack_1bb0 [2];
  float afStack_1ba8 [2];
  float afStack_1ba0 [2];
  float afStack_1b98 [2];
  float afStack_1b90 [2];
  float afStack_1b88 [2];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 uStack_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00 [2];
  float afStack_1af8 [2];
  float afStack_1af0 [2];
  float afStack_1ae8 [2];
  float afStack_1ae0 [2];
  float afStack_1ad8 [2];
  float afStack_1ad0 [2];
  float afStack_1ac8 [2];
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  float local_1a80 [2];
  float afStack_1a78 [2];
  float afStack_1a70 [2];
  float afStack_1a68 [2];
  float afStack_1a60 [2];
  float afStack_1a58 [2];
  float afStack_1a50 [2];
  float afStack_1a48 [2];
  float local_1a40 [2];
  float afStack_1a38 [2];
  float afStack_1a30 [2];
  float afStack_1a28 [2];
  float afStack_1a20 [2];
  float afStack_1a18 [2];
  float afStack_1a10 [2];
  float afStack_1a08 [2];
  float local_1a00 [2];
  float afStack_19f8 [2];
  float afStack_19f0 [2];
  float afStack_19e8 [2];
  float afStack_19e0 [2];
  float afStack_19d8 [2];
  float afStack_19d0 [2];
  float afStack_19c8 [2];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  float local_1980 [2];
  float afStack_1978 [2];
  float afStack_1970 [2];
  float afStack_1968 [2];
  float afStack_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  ushort local_18c2;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float local_17c0 [2];
  float afStack_17b8 [2];
  float afStack_17b0 [2];
  float afStack_17a8 [2];
  float afStack_17a0 [2];
  float afStack_1798 [2];
  float afStack_1790 [2];
  float afStack_1788 [2];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float afStack_16e0 [2];
  float afStack_16d8 [2];
  float afStack_16d0 [2];
  float afStack_16c8 [2];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined4 local_1584;
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined4 local_1488;
  undefined4 local_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined4 uStack_13e4;
  undefined4 local_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [16];
  undefined1 auStack_1370 [16];
  undefined4 local_1360;
  undefined4 local_135c;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined4 local_1350;
  undefined4 local_134c;
  undefined4 local_1348;
  undefined4 local_1344;
  undefined1 local_1340 [16];
  undefined1 auStack_1330 [16];
  undefined4 local_1320;
  undefined4 local_131c;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined4 local_1304;
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [16];
  undefined4 local_12e0;
  undefined4 local_12dc;
  undefined4 local_12d8;
  undefined4 local_12d4;
  undefined4 local_12d0;
  undefined4 local_12cc;
  undefined4 local_12c8;
  undefined4 local_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [8];
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [32];
  undefined4 local_11e0;
  undefined4 uStack_11dc;
  undefined4 uStack_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [8];
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 local_1160 [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined4 local_fc0;
  undefined4 uStack_fbc;
  undefined4 uStack_fb8;
  undefined4 uStack_fb4;
  undefined4 uStack_fb0;
  undefined4 uStack_fac;
  undefined4 uStack_fa8;
  undefined4 uStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined4 local_f80;
  undefined4 uStack_f7c;
  undefined4 uStack_f78;
  undefined4 uStack_f74;
  undefined4 uStack_f70;
  undefined4 uStack_f6c;
  undefined4 uStack_f68;
  undefined4 uStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined4 local_ee0;
  undefined4 uStack_edc;
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  undefined4 uStack_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined4 uStack_e68;
  undefined4 uStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined4 local_e20;
  undefined4 uStack_e1c;
  undefined4 uStack_e18;
  undefined4 uStack_e14;
  undefined4 uStack_e10;
  undefined4 uStack_e0c;
  undefined4 uStack_e08;
  undefined4 uStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined4 local_dc0;
  undefined4 uStack_dbc;
  undefined4 uStack_db8;
  undefined4 uStack_db4;
  undefined4 uStack_db0;
  undefined4 uStack_dac;
  undefined4 uStack_da8;
  undefined4 uStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined4 local_d60;
  undefined4 uStack_d5c;
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  undefined4 uStack_d48;
  undefined4 uStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined4 local_d00;
  undefined4 uStack_cfc;
  undefined4 uStack_cf8;
  undefined4 uStack_cf4;
  undefined4 uStack_cf0;
  undefined4 uStack_cec;
  undefined4 uStack_ce8;
  undefined4 uStack_ce4;
  undefined4 local_ce0;
  undefined4 uStack_cdc;
  undefined4 uStack_cd8;
  undefined4 uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  undefined4 uStack_cc8;
  undefined4 uStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined4 local_c40;
  undefined4 uStack_c3c;
  undefined4 uStack_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined4 uStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined4 local_be0;
  undefined4 uStack_bdc;
  undefined4 uStack_bd8;
  undefined4 uStack_bd4;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 uStack_bc8;
  undefined4 uStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined4 local_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6b4;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined4 local_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined4 local_614;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 local_590 [16];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2b9c = *(int *)((long)in_RSI + 0x2c);
  local_2ba0 = (int)in_RSI[6];
  local_2ba4 = *(int *)((long)in_RSI + 0x34);
  local_2ba8 = (int)in_RSI[7];
  local_2bac = (int)in_RSI[3];
  local_2bb0 = local_2b9c * local_2ba0 * local_2ba4 * local_2bac;
  local_2b90 = in_RSI;
  for (local_2bb4 = 0; local_2bb4 < local_2ba8; local_2bb4 = local_2bb4 + 1) {
    local_2b70 = &local_2c08;
    local_28e4 = *(int *)((long)local_2b90 + 0x2c);
    local_28e8 = (int)local_2b90[6];
    local_28ec = *(undefined4 *)((long)local_2b90 + 0x34);
    local_28f8 = (undefined1 (*) [64])
                 (*local_2b90 + local_2b90[8] * (long)local_2bb4 * local_2b90[2]);
    local_2900 = local_2b90[2];
    local_2904 = (undefined4)local_2b90[3];
    local_2910 = local_2b90[4];
    local_28e0 = &local_2c08;
    local_28d0 = (long)local_28e4 * (long)local_28e8 * local_2900;
    local_2b68 = &local_2c08;
    local_2b58 = &local_2c08;
    local_28d4 = 0x10;
    local_2b7c = local_2bb4;
    local_2b7d = 1;
    local_2c08 = 0;
    local_2bf8 = 0;
    local_2bf0 = 0;
    local_2be0 = 0;
    local_2bdc = 0;
    local_2bd8 = 0;
    local_2bd4 = 0;
    local_2bd0 = 0;
    local_2bc8 = 0;
    local_2c00 = 0;
    local_2bc0 = local_28f8;
    for (local_2c18 = 0; local_2c18 + 0xf < local_2bb0; local_2c18 = local_2c18 + 0x10) {
      local_2b48 = local_2bc0;
      auVar73 = *(undefined1 (*) [56])*local_2bc0;
      uStack_2a88 = *(undefined8 *)(*local_2bc0 + 0x38);
      local_2c80 = auVar73._0_8_;
      local_2ac0 = local_2c80;
      uStack_2c78 = auVar73._8_8_;
      uStack_2ab8 = uStack_2c78;
      uStack_2c70 = auVar73._16_8_;
      uStack_2ab0 = uStack_2c70;
      uStack_2c68 = auVar73._24_8_;
      uStack_2aa8 = uStack_2c68;
      uStack_2c60 = auVar73._32_8_;
      uStack_2aa0 = uStack_2c60;
      uStack_2c58 = auVar73._40_8_;
      uStack_2a98 = uStack_2c58;
      uStack_2c50 = auVar73._48_8_;
      uStack_2a90 = uStack_2c50;
      local_2784 = 0x3f800000;
      local_2800 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2b00 = local_2800._0_8_;
      uStack_2af8 = local_2800._8_8_;
      uStack_2af0 = local_2800._16_8_;
      uStack_2ae8 = local_2800._24_8_;
      uStack_2ae0 = local_2800._32_8_;
      uStack_2ad8 = local_2800._40_8_;
      uStack_2ad0 = local_2800._48_8_;
      uStack_2ac8 = local_2800._56_8_;
      local_2804 = 0x40000000;
      local_2880 = vbroadcastss_avx512f(ZEXT416(0x40000000));
      local_2b40 = local_2880._0_8_;
      uStack_2b38 = local_2880._8_8_;
      uStack_2b30 = local_2880._16_8_;
      uStack_2b28 = local_2880._24_8_;
      uStack_2b20 = local_2880._32_8_;
      uStack_2b18 = local_2880._40_8_;
      uStack_2b10 = local_2880._48_8_;
      uStack_2b08 = local_2880._56_8_;
      local_2580 = local_2c80;
      uStack_2578 = uStack_2c78;
      uStack_2570 = uStack_2c70;
      uStack_2568 = uStack_2c68;
      uStack_2560 = uStack_2c60;
      uStack_2558 = uStack_2c58;
      uStack_2550 = uStack_2c50;
      local_25c0 = local_2880._0_8_;
      uStack_25b8 = local_2880._8_8_;
      uStack_25b0 = local_2880._16_8_;
      uStack_25a8 = local_2880._24_8_;
      uStack_25a0 = local_2880._32_8_;
      uStack_2598 = local_2880._40_8_;
      uStack_2590 = local_2880._48_8_;
      uStack_2588 = local_2880._56_8_;
      local_2680 = vmulps_avx512f(*local_2bc0,local_2880);
      local_25c4 = 0x3f800000;
      local_2640 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_26c0 = local_2640._0_8_;
      uStack_26b8 = local_2640._8_8_;
      uStack_26b0 = local_2640._16_8_;
      uStack_26a8 = local_2640._24_8_;
      uStack_26a0 = local_2640._32_8_;
      uStack_2698 = local_2640._40_8_;
      uStack_2690 = local_2640._48_8_;
      uStack_2688 = local_2640._56_8_;
      local_2500 = local_2640._0_8_;
      uStack_24f8 = local_2640._8_8_;
      uStack_24f0 = local_2640._16_8_;
      uStack_24e8 = local_2640._24_8_;
      uStack_24e0 = local_2640._32_8_;
      uStack_24d8 = local_2640._40_8_;
      uStack_24d0 = local_2640._48_8_;
      uStack_24c8 = local_2640._56_8_;
      local_2000 = 0;
      uStack_1ff8 = 0;
      uStack_1ff0 = 0;
      uStack_1fe8 = 0;
      uStack_1fe0 = 0;
      uStack_1fd8 = 0;
      uStack_1fd0 = 0;
      uStack_1fc8 = 0;
      local_2080 = 0;
      uStack_2078 = 0;
      uStack_2070 = 0;
      uStack_2068 = 0;
      uStack_2060 = 0;
      uStack_2058 = 0;
      uStack_2050 = 0;
      uStack_2048 = 0;
      local_20c0 = local_2680._0_8_;
      uStack_20b8 = local_2680._8_8_;
      uStack_20b0 = local_2680._16_8_;
      uStack_20a8 = local_2680._24_8_;
      uStack_20a0 = local_2680._32_8_;
      uStack_2098 = local_2680._40_8_;
      uStack_2090 = local_2680._48_8_;
      uStack_2088 = local_2680._56_8_;
      auVar78 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_2680);
      local_2040 = 0;
      uStack_2038 = 0;
      uStack_2030 = 0;
      uStack_2028 = 0;
      uStack_2020 = 0;
      uStack_2018 = 0;
      uStack_2010 = 0;
      uStack_2008 = 0;
      local_2380[0] = 1.0;
      local_2380[1] = 1.0;
      afStack_2378[0] = 1.0;
      afStack_2378[1] = 1.0;
      afStack_2370[0] = 1.0;
      afStack_2370[1] = 1.0;
      afStack_2368[0] = 1.0;
      afStack_2368[1] = 1.0;
      afStack_2360[0] = 1.0;
      afStack_2360[1] = 1.0;
      afStack_2358[0] = 1.0;
      afStack_2358[1] = 1.0;
      afStack_2350[0] = 1.0;
      afStack_2350[1] = 1.0;
      afStack_2348[0] = 1.0;
      afStack_2348[1] = 1.0;
      local_2280._0_8_ = auVar78._0_8_;
      local_1f80 = local_2280._0_8_;
      local_2280._8_8_ = auVar78._8_8_;
      uStack_1f78 = local_2280._8_8_;
      local_2280._16_8_ = auVar78._16_8_;
      uStack_1f70 = local_2280._16_8_;
      local_2280._24_8_ = auVar78._24_8_;
      uStack_1f68 = local_2280._24_8_;
      local_2280._32_8_ = auVar78._32_8_;
      uStack_1f60 = local_2280._32_8_;
      local_2280._40_8_ = auVar78._40_8_;
      uStack_1f58 = local_2280._40_8_;
      local_2280._48_8_ = auVar78._48_8_;
      uStack_1f50 = local_2280._48_8_;
      local_2280._56_8_ = auVar78._56_8_;
      uStack_1f48 = local_2280._56_8_;
      local_1fc0[0] = 88.37626;
      local_1fc0[1] = 88.37626;
      afStack_1fb8[0] = 88.37626;
      afStack_1fb8[1] = 88.37626;
      afStack_1fb0[0] = 88.37626;
      afStack_1fb0[1] = 88.37626;
      afStack_1fa8[0] = 88.37626;
      afStack_1fa8[1] = 88.37626;
      afStack_1fa0[0] = 88.37626;
      afStack_1fa0[1] = 88.37626;
      afStack_1f98[0] = 88.37626;
      afStack_1f98[1] = 88.37626;
      afStack_1f90[0] = 88.37626;
      afStack_1f90[1] = 88.37626;
      afStack_1f88[0] = 88.37626;
      afStack_1f88[1] = 88.37626;
      auVar79._8_4_ = 88.37626;
      auVar79._12_4_ = 88.37626;
      auVar79._0_4_ = 88.37626;
      auVar79._4_4_ = 88.37626;
      auVar79._16_4_ = 88.37626;
      auVar79._20_4_ = 88.37626;
      auVar79._24_4_ = 88.37626;
      auVar79._28_4_ = 88.37626;
      auVar79._32_4_ = 88.37626;
      auVar79._36_4_ = 88.37626;
      auVar79._40_4_ = 88.37626;
      auVar79._44_4_ = 88.37626;
      auVar79._48_4_ = 88.37626;
      auVar79._52_4_ = 88.37626;
      auVar79._56_4_ = 88.37626;
      auVar79._60_4_ = 88.37626;
      auVar78 = vminps_avx512f(auVar78,auVar79);
      local_2280._0_8_ = auVar78._0_8_;
      local_1f00 = local_2280._0_8_;
      local_2280._8_8_ = auVar78._8_8_;
      uStack_1ef8 = local_2280._8_8_;
      local_2280._16_8_ = auVar78._16_8_;
      uStack_1ef0 = local_2280._16_8_;
      local_2280._24_8_ = auVar78._24_8_;
      uStack_1ee8 = local_2280._24_8_;
      local_2280._32_8_ = auVar78._32_8_;
      uStack_1ee0 = local_2280._32_8_;
      local_2280._40_8_ = auVar78._40_8_;
      uStack_1ed8 = local_2280._40_8_;
      local_2280._48_8_ = auVar78._48_8_;
      uStack_1ed0 = local_2280._48_8_;
      local_2280._56_8_ = auVar78._56_8_;
      uStack_1ec8 = local_2280._56_8_;
      local_1f40[0] = -88.37626;
      local_1f40[1] = -88.37626;
      afStack_1f38[0] = -88.37626;
      afStack_1f38[1] = -88.37626;
      afStack_1f30[0] = -88.37626;
      afStack_1f30[1] = -88.37626;
      afStack_1f28[0] = -88.37626;
      afStack_1f28[1] = -88.37626;
      afStack_1f20[0] = -88.37626;
      afStack_1f20[1] = -88.37626;
      afStack_1f18[0] = -88.37626;
      afStack_1f18[1] = -88.37626;
      afStack_1f10[0] = -88.37626;
      afStack_1f10[1] = -88.37626;
      afStack_1f08[0] = -88.37626;
      afStack_1f08[1] = -88.37626;
      auVar80._8_4_ = -88.37626;
      auVar80._12_4_ = -88.37626;
      auVar80._0_4_ = -88.37626;
      auVar80._4_4_ = -88.37626;
      auVar80._16_4_ = -88.37626;
      auVar80._20_4_ = -88.37626;
      auVar80._24_4_ = -88.37626;
      auVar80._28_4_ = -88.37626;
      auVar80._32_4_ = -88.37626;
      auVar80._36_4_ = -88.37626;
      auVar80._40_4_ = -88.37626;
      auVar80._44_4_ = -88.37626;
      auVar80._48_4_ = -88.37626;
      auVar80._52_4_ = -88.37626;
      auVar80._56_4_ = -88.37626;
      auVar80._60_4_ = -88.37626;
      auVar78 = vmaxps_avx512f(auVar78,auVar80);
      local_2280._0_8_ = auVar78._0_8_;
      local_19c0 = local_2280._0_8_;
      local_2280._8_8_ = auVar78._8_8_;
      uStack_19b8 = local_2280._8_8_;
      local_2280._16_8_ = auVar78._16_8_;
      uStack_19b0 = local_2280._16_8_;
      local_2280._24_8_ = auVar78._24_8_;
      uStack_19a8 = local_2280._24_8_;
      local_2280._32_8_ = auVar78._32_8_;
      uStack_19a0 = local_2280._32_8_;
      local_2280._40_8_ = auVar78._40_8_;
      uStack_1998 = local_2280._40_8_;
      local_2280._48_8_ = auVar78._48_8_;
      uStack_1990 = local_2280._48_8_;
      local_2280._56_8_ = auVar78._56_8_;
      uStack_1988 = local_2280._56_8_;
      local_1a00[0] = 1.442695;
      local_1a00[1] = 1.442695;
      afStack_19f8[0] = 1.442695;
      afStack_19f8[1] = 1.442695;
      afStack_19f0[0] = 1.442695;
      afStack_19f0[1] = 1.442695;
      afStack_19e8[0] = 1.442695;
      afStack_19e8[1] = 1.442695;
      afStack_19e0[0] = 1.442695;
      afStack_19e0[1] = 1.442695;
      afStack_19d8[0] = 1.442695;
      afStack_19d8[1] = 1.442695;
      afStack_19d0[0] = 1.442695;
      afStack_19d0[1] = 1.442695;
      afStack_19c8[0] = 1.442695;
      afStack_19c8[1] = 1.442695;
      local_1a40[0] = 0.5;
      local_1a40[1] = 0.5;
      afStack_1a38[0] = 0.5;
      afStack_1a38[1] = 0.5;
      afStack_1a30[0] = 0.5;
      afStack_1a30[1] = 0.5;
      afStack_1a28[0] = 0.5;
      afStack_1a28[1] = 0.5;
      afStack_1a20[0] = 0.5;
      afStack_1a20[1] = 0.5;
      afStack_1a18[0] = 0.5;
      afStack_1a18[1] = 0.5;
      afStack_1a10[0] = 0.5;
      afStack_1a10[1] = 0.5;
      afStack_1a08[0] = 0.5;
      afStack_1a08[1] = 0.5;
      auVar32._8_4_ = 1.442695;
      auVar32._12_4_ = 1.442695;
      auVar32._0_4_ = 1.442695;
      auVar32._4_4_ = 1.442695;
      auVar32._16_4_ = 1.442695;
      auVar32._20_4_ = 1.442695;
      auVar32._24_4_ = 1.442695;
      auVar32._28_4_ = 1.442695;
      auVar32._32_4_ = 1.442695;
      auVar32._36_4_ = 1.442695;
      auVar32._40_4_ = 1.442695;
      auVar32._44_4_ = 1.442695;
      auVar32._48_4_ = 1.442695;
      auVar32._52_4_ = 1.442695;
      auVar32._56_4_ = 1.442695;
      auVar32._60_4_ = 1.442695;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar31._32_4_ = 0.5;
      auVar31._36_4_ = 0.5;
      auVar31._40_4_ = 0.5;
      auVar31._44_4_ = 0.5;
      auVar31._48_4_ = 0.5;
      auVar31._52_4_ = 0.5;
      auVar31._56_4_ = 0.5;
      auVar31._60_4_ = 0.5;
      auVar79 = vfmadd213ps_avx512f(auVar32,auVar78,auVar31);
      auVar80 = vrndscaleps_avx512f(auVar79,1);
      uVar21 = vcmpps_avx512f(auVar79,auVar80,1);
      local_2382 = (ushort)uVar21;
      local_22c0._0_8_ = auVar80._0_8_;
      local_1940 = local_22c0._0_8_;
      local_22c0._8_8_ = auVar80._8_8_;
      uStack_1938 = local_22c0._8_8_;
      local_22c0._16_8_ = auVar80._16_8_;
      uStack_1930 = local_22c0._16_8_;
      local_22c0._24_8_ = auVar80._24_8_;
      uStack_1928 = local_22c0._24_8_;
      local_22c0._32_8_ = auVar80._32_8_;
      uStack_1920 = local_22c0._32_8_;
      local_22c0._40_8_ = auVar80._40_8_;
      uStack_1918 = local_22c0._40_8_;
      local_22c0._48_8_ = auVar80._48_8_;
      uStack_1910 = local_22c0._48_8_;
      local_22c0._56_8_ = auVar80._56_8_;
      uStack_1908 = local_22c0._56_8_;
      local_1980[0] = 1.0;
      local_1980[1] = 1.0;
      afStack_1978[0] = 1.0;
      afStack_1978[1] = 1.0;
      afStack_1970[0] = 1.0;
      afStack_1970[1] = 1.0;
      afStack_1968[0] = 1.0;
      afStack_1968[1] = 1.0;
      afStack_1960[0] = 1.0;
      afStack_1960[1] = 1.0;
      afStack_1958[0] = 1.0;
      afStack_1958[1] = 1.0;
      afStack_1950[0] = 1.0;
      afStack_1950[1] = 1.0;
      afStack_1948[0] = 1.0;
      afStack_1948[1] = 1.0;
      local_1840 = local_22c0._0_8_;
      uStack_1838 = local_22c0._8_8_;
      uStack_1830 = local_22c0._16_8_;
      uStack_1828 = local_22c0._24_8_;
      uStack_1820 = local_22c0._32_8_;
      uStack_1818 = local_22c0._40_8_;
      uStack_1810 = local_22c0._48_8_;
      uStack_1808 = local_22c0._56_8_;
      local_1880[0] = 1.0;
      local_1880[1] = 1.0;
      afStack_1878[0] = 1.0;
      afStack_1878[1] = 1.0;
      afStack_1870[0] = 1.0;
      afStack_1870[1] = 1.0;
      afStack_1868[0] = 1.0;
      afStack_1868[1] = 1.0;
      afStack_1860[0] = 1.0;
      afStack_1860[1] = 1.0;
      afStack_1858[0] = 1.0;
      afStack_1858[1] = 1.0;
      afStack_1850[0] = 1.0;
      afStack_1850[1] = 1.0;
      afStack_1848[0] = 1.0;
      afStack_1848[1] = 1.0;
      auVar33._8_4_ = 1.0;
      auVar33._12_4_ = 1.0;
      auVar33._0_4_ = 1.0;
      auVar33._4_4_ = 1.0;
      auVar33._16_4_ = 1.0;
      auVar33._20_4_ = 1.0;
      auVar33._24_4_ = 1.0;
      auVar33._28_4_ = 1.0;
      auVar33._32_4_ = 1.0;
      auVar33._36_4_ = 1.0;
      auVar33._40_4_ = 1.0;
      auVar33._44_4_ = 1.0;
      auVar33._48_4_ = 1.0;
      auVar33._52_4_ = 1.0;
      auVar33._56_4_ = 1.0;
      auVar33._60_4_ = 1.0;
      local_18c0._0_4_ = auVar80._0_4_;
      local_18c0._4_4_ = auVar80._4_4_;
      uStack_18b8._0_4_ = auVar80._8_4_;
      uStack_18b8._4_4_ = auVar80._12_4_;
      uStack_18b0._0_4_ = auVar80._16_4_;
      uStack_18b0._4_4_ = auVar80._20_4_;
      uStack_18a8._0_4_ = auVar80._24_4_;
      uStack_18a8._4_4_ = auVar80._28_4_;
      uStack_18a0._0_4_ = auVar80._32_4_;
      uStack_18a0._4_4_ = auVar80._36_4_;
      uStack_1898._0_4_ = auVar80._40_4_;
      uStack_1898._4_4_ = auVar80._44_4_;
      uStack_1890._0_4_ = auVar80._48_4_;
      uStack_1890._4_4_ = auVar80._52_4_;
      uStack_1888._0_4_ = auVar80._56_4_;
      uStack_1888._4_4_ = auVar80._60_4_;
      auVar79 = vsubps_avx512f(auVar80,auVar33);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2382 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2382 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2382 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2382 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2382 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2382 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2382 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar21 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_2300._4_4_ = (uint)bVar2 * auVar79._4_4_ | (uint)!bVar2 * local_18c0._4_4_;
      local_2300._0_4_ = (uint)bVar1 * auVar79._0_4_ | (uint)!bVar1 * (int)local_18c0;
      local_2300._8_4_ = (uint)bVar3 * auVar79._8_4_ | (uint)!bVar3 * (int)uStack_18b8;
      local_2300._12_4_ = (uint)bVar4 * auVar79._12_4_ | (uint)!bVar4 * uStack_18b8._4_4_;
      uStack_22f0._0_4_ = (uint)bVar5 * auVar79._16_4_ | (uint)!bVar5 * (int)uStack_18b0;
      uStack_22f0._4_4_ = (uint)bVar6 * auVar79._20_4_ | (uint)!bVar6 * uStack_18b0._4_4_;
      auVar74 = _local_2300;
      uStack_22e8._0_4_ = (uint)bVar7 * auVar79._24_4_ | (uint)!bVar7 * (int)uStack_18a8;
      uStack_22e8._4_4_ = (uint)bVar8 * auVar79._28_4_ | (uint)!bVar8 * uStack_18a8._4_4_;
      auVar20 = _local_2300;
      uStack_22e0._0_4_ =
           (uint)(bVar9 & 1) * auVar79._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_18a0;
      uStack_22e0._4_4_ = (uint)bVar10 * auVar79._36_4_ | (uint)!bVar10 * uStack_18a0._4_4_;
      auVar75 = _local_2300;
      uStack_22d8._0_4_ = (uint)bVar11 * auVar79._40_4_ | (uint)!bVar11 * (int)uStack_1898;
      uStack_22d8._4_4_ = (uint)bVar12 * auVar79._44_4_ | (uint)!bVar12 * uStack_1898._4_4_;
      auVar76 = _local_2300;
      uStack_22d0._0_4_ = (uint)bVar13 * auVar79._48_4_ | (uint)!bVar13 * (int)uStack_1890;
      uStack_22d0._4_4_ = (uint)bVar14 * auVar79._52_4_ | (uint)!bVar14 * uStack_1890._4_4_;
      auVar73 = _local_2300;
      uStack_22c8._0_4_ = (uint)bVar15 * auVar79._56_4_ | (uint)!bVar15 * (int)uStack_1888;
      uStack_22c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar79._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1888._4_4_;
      auVar79 = _local_2300;
      local_16c0 = local_2300._0_8_;
      uStack_16b8 = local_2300._8_8_;
      uStack_22f0 = auVar74._16_8_;
      uStack_16b0 = uStack_22f0;
      uStack_22e8 = auVar20._24_8_;
      uStack_16a8 = uStack_22e8;
      uStack_22e0 = auVar75._32_8_;
      uStack_16a0 = uStack_22e0;
      uStack_22d8 = auVar76._40_8_;
      uStack_1698 = uStack_22d8;
      uStack_22d0 = auVar73._48_8_;
      uStack_1690 = uStack_22d0;
      uStack_22c8 = auVar79._56_8_;
      uStack_1688 = uStack_22c8;
      local_1700[0] = 0.6933594;
      local_1700[1] = 0.6933594;
      afStack_16f8[0] = 0.6933594;
      afStack_16f8[1] = 0.6933594;
      afStack_16f0[0] = 0.6933594;
      afStack_16f0[1] = 0.6933594;
      afStack_16e8[0] = 0.6933594;
      afStack_16e8[1] = 0.6933594;
      afStack_16e0[0] = 0.6933594;
      afStack_16e0[1] = 0.6933594;
      afStack_16d8[0] = 0.6933594;
      afStack_16d8[1] = 0.6933594;
      afStack_16d0[0] = 0.6933594;
      afStack_16d0[1] = 0.6933594;
      afStack_16c8[0] = 0.6933594;
      afStack_16c8[1] = 0.6933594;
      local_1740 = local_2280._0_8_;
      uStack_1738 = local_2280._8_8_;
      uStack_1730 = local_2280._16_8_;
      uStack_1728 = local_2280._24_8_;
      uStack_1720 = local_2280._32_8_;
      uStack_1718 = local_2280._40_8_;
      uStack_1710 = local_2280._48_8_;
      uStack_1708 = local_2280._56_8_;
      auVar37._16_8_ = uStack_22f0;
      auVar37._0_16_ = local_2300;
      auVar37._24_8_ = uStack_22e8;
      auVar37._32_8_ = uStack_22e0;
      auVar37._40_8_ = uStack_22d8;
      auVar37._48_8_ = uStack_22d0;
      auVar37._56_8_ = uStack_22c8;
      auVar36._8_4_ = 0.6933594;
      auVar36._12_4_ = 0.6933594;
      auVar36._0_4_ = 0.6933594;
      auVar36._4_4_ = 0.6933594;
      auVar36._16_4_ = 0.6933594;
      auVar36._20_4_ = 0.6933594;
      auVar36._24_4_ = 0.6933594;
      auVar36._28_4_ = 0.6933594;
      auVar36._32_4_ = 0.6933594;
      auVar36._36_4_ = 0.6933594;
      auVar36._40_4_ = 0.6933594;
      auVar36._44_4_ = 0.6933594;
      auVar36._48_4_ = 0.6933594;
      auVar36._52_4_ = 0.6933594;
      auVar36._56_4_ = 0.6933594;
      auVar36._60_4_ = 0.6933594;
      auVar78 = vfnmadd213ps_avx512f(auVar36,auVar37,auVar78);
      local_1780 = local_2300._0_8_;
      uStack_1778 = local_2300._8_8_;
      uStack_1770 = uStack_22f0;
      uStack_1768 = uStack_22e8;
      uStack_1760 = uStack_22e0;
      uStack_1758 = uStack_22d8;
      uStack_1750 = uStack_22d0;
      uStack_1748 = uStack_22c8;
      local_17c0[0] = -0.00021219444;
      local_17c0[1] = -0.00021219444;
      afStack_17b8[0] = -0.00021219444;
      afStack_17b8[1] = -0.00021219444;
      afStack_17b0[0] = -0.00021219444;
      afStack_17b0[1] = -0.00021219444;
      afStack_17a8[0] = -0.00021219444;
      afStack_17a8[1] = -0.00021219444;
      afStack_17a0[0] = -0.00021219444;
      afStack_17a0[1] = -0.00021219444;
      afStack_1798[0] = -0.00021219444;
      afStack_1798[1] = -0.00021219444;
      afStack_1790[0] = -0.00021219444;
      afStack_1790[1] = -0.00021219444;
      afStack_1788[0] = -0.00021219444;
      afStack_1788[1] = -0.00021219444;
      local_2280._0_8_ = auVar78._0_8_;
      local_1800 = local_2280._0_8_;
      local_2280._8_8_ = auVar78._8_8_;
      uStack_17f8 = local_2280._8_8_;
      local_2280._16_8_ = auVar78._16_8_;
      uStack_17f0 = local_2280._16_8_;
      local_2280._24_8_ = auVar78._24_8_;
      uStack_17e8 = local_2280._24_8_;
      local_2280._32_8_ = auVar78._32_8_;
      uStack_17e0 = local_2280._32_8_;
      local_2280._40_8_ = auVar78._40_8_;
      uStack_17d8 = local_2280._40_8_;
      local_2280._48_8_ = auVar78._48_8_;
      uStack_17d0 = local_2280._48_8_;
      local_2280._56_8_ = auVar78._56_8_;
      uStack_17c8 = local_2280._56_8_;
      auVar35._16_8_ = uStack_22f0;
      auVar35._0_16_ = local_2300;
      auVar35._24_8_ = uStack_22e8;
      auVar35._32_8_ = uStack_22e0;
      auVar35._40_8_ = uStack_22d8;
      auVar35._48_8_ = uStack_22d0;
      auVar35._56_8_ = uStack_22c8;
      auVar34._8_4_ = -0.00021219444;
      auVar34._12_4_ = -0.00021219444;
      auVar34._0_4_ = -0.00021219444;
      auVar34._4_4_ = -0.00021219444;
      auVar34._16_4_ = -0.00021219444;
      auVar34._20_4_ = -0.00021219444;
      auVar34._24_4_ = -0.00021219444;
      auVar34._28_4_ = -0.00021219444;
      auVar34._32_4_ = -0.00021219444;
      auVar34._36_4_ = -0.00021219444;
      auVar34._40_4_ = -0.00021219444;
      auVar34._44_4_ = -0.00021219444;
      auVar34._48_4_ = -0.00021219444;
      auVar34._52_4_ = -0.00021219444;
      auVar34._56_4_ = -0.00021219444;
      auVar34._60_4_ = -0.00021219444;
      local_2280 = vfnmadd213ps_avx512f(auVar34,auVar35,auVar78);
      local_21c0 = local_2280._0_8_;
      uStack_21b8 = local_2280._8_8_;
      uStack_21b0 = local_2280._16_8_;
      uStack_21a8 = local_2280._24_8_;
      uStack_21a0 = local_2280._32_8_;
      uStack_2198 = local_2280._40_8_;
      uStack_2190 = local_2280._48_8_;
      uStack_2188 = local_2280._56_8_;
      local_22c0 = vmulps_avx512f(local_2280,local_2280);
      uStack_23f8._0_4_ = 0.00019875691;
      uStack_23f8._4_4_ = 0.00019875691;
      local_2400._0_4_ = 0.00019875691;
      local_2400._4_4_ = 0.00019875691;
      local_1a80[0] = 0.00019875691;
      local_1a80[1] = 0.00019875691;
      afStack_1a78[0] = 0.00019875691;
      afStack_1a78[1] = 0.00019875691;
      afStack_1a70[0] = 0.00019875691;
      afStack_1a70[1] = 0.00019875691;
      afStack_1a68[0] = 0.00019875691;
      afStack_1a68[1] = 0.00019875691;
      afStack_1a60[0] = 0.00019875691;
      afStack_1a60[1] = 0.00019875691;
      afStack_1a58[0] = 0.00019875691;
      afStack_1a58[1] = 0.00019875691;
      afStack_1a50[0] = 0.00019875691;
      afStack_1a50[1] = 0.00019875691;
      afStack_1a48[0] = 0.00019875691;
      afStack_1a48[1] = 0.00019875691;
      local_1ac0 = local_2280._0_8_;
      uStack_1ab8 = local_2280._8_8_;
      uStack_1ab0 = local_2280._16_8_;
      uStack_1aa8 = local_2280._24_8_;
      uStack_1aa0 = local_2280._32_8_;
      uStack_1a98 = local_2280._40_8_;
      uStack_1a90 = local_2280._48_8_;
      uStack_1a88 = local_2280._56_8_;
      local_1b00[0] = 0.0013981999;
      local_1b00[1] = 0.0013981999;
      afStack_1af8[0] = 0.0013981999;
      afStack_1af8[1] = 0.0013981999;
      afStack_1af0[0] = 0.0013981999;
      afStack_1af0[1] = 0.0013981999;
      afStack_1ae8[0] = 0.0013981999;
      afStack_1ae8[1] = 0.0013981999;
      afStack_1ae0[0] = 0.0013981999;
      afStack_1ae0[1] = 0.0013981999;
      afStack_1ad8[0] = 0.0013981999;
      afStack_1ad8[1] = 0.0013981999;
      afStack_1ad0[0] = 0.0013981999;
      afStack_1ad0[1] = 0.0013981999;
      afStack_1ac8[0] = 0.0013981999;
      afStack_1ac8[1] = 0.0013981999;
      auVar30._16_4_ = 0.00019875691;
      auVar30._20_4_ = 0.00019875691;
      auVar30._0_16_ = _local_2400;
      auVar30._24_4_ = 0.00019875691;
      auVar30._28_4_ = 0.00019875691;
      auVar30._32_4_ = 0.00019875691;
      auVar30._36_4_ = 0.00019875691;
      auVar30._40_4_ = 0.00019875691;
      auVar30._44_4_ = 0.00019875691;
      auVar30._48_4_ = 0.00019875691;
      auVar30._52_4_ = 0.00019875691;
      auVar30._56_4_ = 0.00019875691;
      auVar30._60_4_ = 0.00019875691;
      auVar29._8_4_ = 0.0013981999;
      auVar29._12_4_ = 0.0013981999;
      auVar29._0_4_ = 0.0013981999;
      auVar29._4_4_ = 0.0013981999;
      auVar29._16_4_ = 0.0013981999;
      auVar29._20_4_ = 0.0013981999;
      auVar29._24_4_ = 0.0013981999;
      auVar29._28_4_ = 0.0013981999;
      auVar29._32_4_ = 0.0013981999;
      auVar29._36_4_ = 0.0013981999;
      auVar29._40_4_ = 0.0013981999;
      auVar29._44_4_ = 0.0013981999;
      auVar29._48_4_ = 0.0013981999;
      auVar29._52_4_ = 0.0013981999;
      auVar29._56_4_ = 0.0013981999;
      auVar29._60_4_ = 0.0013981999;
      auVar78 = vfmadd213ps_avx512f(local_2280,auVar30,auVar29);
      local_2400 = auVar78._0_8_;
      local_1b40 = local_2400;
      uStack_23f8 = auVar78._8_8_;
      uStack_1b38 = uStack_23f8;
      uStack_23f0 = auVar78._16_8_;
      uStack_1b30 = uStack_23f0;
      uStack_23e8 = auVar78._24_8_;
      uStack_1b28 = uStack_23e8;
      uStack_23e0 = auVar78._32_8_;
      uStack_1b20 = uStack_23e0;
      uStack_23d8 = auVar78._40_8_;
      uStack_1b18 = uStack_23d8;
      uStack_23d0 = auVar78._48_8_;
      uStack_1b10 = uStack_23d0;
      uStack_23c8 = auVar78._56_8_;
      uStack_1b08 = uStack_23c8;
      local_1b80 = local_2280._0_8_;
      uStack_1b78 = local_2280._8_8_;
      uStack_1b70 = local_2280._16_8_;
      uStack_1b68 = local_2280._24_8_;
      uStack_1b60 = local_2280._32_8_;
      uStack_1b58 = local_2280._40_8_;
      uStack_1b50 = local_2280._48_8_;
      uStack_1b48 = local_2280._56_8_;
      local_1bc0[0] = 0.008333452;
      local_1bc0[1] = 0.008333452;
      afStack_1bb8[0] = 0.008333452;
      afStack_1bb8[1] = 0.008333452;
      afStack_1bb0[0] = 0.008333452;
      afStack_1bb0[1] = 0.008333452;
      afStack_1ba8[0] = 0.008333452;
      afStack_1ba8[1] = 0.008333452;
      afStack_1ba0[0] = 0.008333452;
      afStack_1ba0[1] = 0.008333452;
      afStack_1b98[0] = 0.008333452;
      afStack_1b98[1] = 0.008333452;
      afStack_1b90[0] = 0.008333452;
      afStack_1b90[1] = 0.008333452;
      afStack_1b88[0] = 0.008333452;
      afStack_1b88[1] = 0.008333452;
      auVar28._8_4_ = 0.008333452;
      auVar28._12_4_ = 0.008333452;
      auVar28._0_4_ = 0.008333452;
      auVar28._4_4_ = 0.008333452;
      auVar28._16_4_ = 0.008333452;
      auVar28._20_4_ = 0.008333452;
      auVar28._24_4_ = 0.008333452;
      auVar28._28_4_ = 0.008333452;
      auVar28._32_4_ = 0.008333452;
      auVar28._36_4_ = 0.008333452;
      auVar28._40_4_ = 0.008333452;
      auVar28._44_4_ = 0.008333452;
      auVar28._48_4_ = 0.008333452;
      auVar28._52_4_ = 0.008333452;
      auVar28._56_4_ = 0.008333452;
      auVar28._60_4_ = 0.008333452;
      auVar78 = vfmadd213ps_avx512f(local_2280,auVar78,auVar28);
      local_2400 = auVar78._0_8_;
      local_1c00 = local_2400;
      uStack_23f8 = auVar78._8_8_;
      uStack_1bf8 = uStack_23f8;
      uStack_23f0 = auVar78._16_8_;
      uStack_1bf0 = uStack_23f0;
      uStack_23e8 = auVar78._24_8_;
      uStack_1be8 = uStack_23e8;
      uStack_23e0 = auVar78._32_8_;
      uStack_1be0 = uStack_23e0;
      uStack_23d8 = auVar78._40_8_;
      uStack_1bd8 = uStack_23d8;
      uStack_23d0 = auVar78._48_8_;
      uStack_1bd0 = uStack_23d0;
      uStack_23c8 = auVar78._56_8_;
      uStack_1bc8 = uStack_23c8;
      local_1c40 = local_2280._0_8_;
      uStack_1c38 = local_2280._8_8_;
      uStack_1c30 = local_2280._16_8_;
      uStack_1c28 = local_2280._24_8_;
      uStack_1c20 = local_2280._32_8_;
      uStack_1c18 = local_2280._40_8_;
      uStack_1c10 = local_2280._48_8_;
      uStack_1c08 = local_2280._56_8_;
      local_1c80[0] = 0.041665796;
      local_1c80[1] = 0.041665796;
      afStack_1c78[0] = 0.041665796;
      afStack_1c78[1] = 0.041665796;
      afStack_1c70[0] = 0.041665796;
      afStack_1c70[1] = 0.041665796;
      afStack_1c68[0] = 0.041665796;
      afStack_1c68[1] = 0.041665796;
      afStack_1c60[0] = 0.041665796;
      afStack_1c60[1] = 0.041665796;
      afStack_1c58[0] = 0.041665796;
      afStack_1c58[1] = 0.041665796;
      afStack_1c50[0] = 0.041665796;
      afStack_1c50[1] = 0.041665796;
      afStack_1c48[0] = 0.041665796;
      afStack_1c48[1] = 0.041665796;
      auVar27._8_4_ = 0.041665796;
      auVar27._12_4_ = 0.041665796;
      auVar27._0_4_ = 0.041665796;
      auVar27._4_4_ = 0.041665796;
      auVar27._16_4_ = 0.041665796;
      auVar27._20_4_ = 0.041665796;
      auVar27._24_4_ = 0.041665796;
      auVar27._28_4_ = 0.041665796;
      auVar27._32_4_ = 0.041665796;
      auVar27._36_4_ = 0.041665796;
      auVar27._40_4_ = 0.041665796;
      auVar27._44_4_ = 0.041665796;
      auVar27._48_4_ = 0.041665796;
      auVar27._52_4_ = 0.041665796;
      auVar27._56_4_ = 0.041665796;
      auVar27._60_4_ = 0.041665796;
      auVar78 = vfmadd213ps_avx512f(local_2280,auVar78,auVar27);
      local_2400 = auVar78._0_8_;
      local_1cc0 = local_2400;
      uStack_23f8 = auVar78._8_8_;
      uStack_1cb8 = uStack_23f8;
      uStack_23f0 = auVar78._16_8_;
      uStack_1cb0 = uStack_23f0;
      uStack_23e8 = auVar78._24_8_;
      uStack_1ca8 = uStack_23e8;
      uStack_23e0 = auVar78._32_8_;
      uStack_1ca0 = uStack_23e0;
      uStack_23d8 = auVar78._40_8_;
      uStack_1c98 = uStack_23d8;
      uStack_23d0 = auVar78._48_8_;
      uStack_1c90 = uStack_23d0;
      uStack_23c8 = auVar78._56_8_;
      uStack_1c88 = uStack_23c8;
      local_1d00 = local_2280._0_8_;
      uStack_1cf8 = local_2280._8_8_;
      uStack_1cf0 = local_2280._16_8_;
      uStack_1ce8 = local_2280._24_8_;
      uStack_1ce0 = local_2280._32_8_;
      uStack_1cd8 = local_2280._40_8_;
      uStack_1cd0 = local_2280._48_8_;
      uStack_1cc8 = local_2280._56_8_;
      local_1d40[0] = 0.16666666;
      local_1d40[1] = 0.16666666;
      afStack_1d38[0] = 0.16666666;
      afStack_1d38[1] = 0.16666666;
      afStack_1d30[0] = 0.16666666;
      afStack_1d30[1] = 0.16666666;
      afStack_1d28[0] = 0.16666666;
      afStack_1d28[1] = 0.16666666;
      afStack_1d20[0] = 0.16666666;
      afStack_1d20[1] = 0.16666666;
      afStack_1d18[0] = 0.16666666;
      afStack_1d18[1] = 0.16666666;
      afStack_1d10[0] = 0.16666666;
      afStack_1d10[1] = 0.16666666;
      afStack_1d08[0] = 0.16666666;
      afStack_1d08[1] = 0.16666666;
      auVar26._8_4_ = 0.16666666;
      auVar26._12_4_ = 0.16666666;
      auVar26._0_4_ = 0.16666666;
      auVar26._4_4_ = 0.16666666;
      auVar26._16_4_ = 0.16666666;
      auVar26._20_4_ = 0.16666666;
      auVar26._24_4_ = 0.16666666;
      auVar26._28_4_ = 0.16666666;
      auVar26._32_4_ = 0.16666666;
      auVar26._36_4_ = 0.16666666;
      auVar26._40_4_ = 0.16666666;
      auVar26._44_4_ = 0.16666666;
      auVar26._48_4_ = 0.16666666;
      auVar26._52_4_ = 0.16666666;
      auVar26._56_4_ = 0.16666666;
      auVar26._60_4_ = 0.16666666;
      auVar78 = vfmadd213ps_avx512f(local_2280,auVar78,auVar26);
      local_2400 = auVar78._0_8_;
      local_1d80 = local_2400;
      uStack_23f8 = auVar78._8_8_;
      uStack_1d78 = uStack_23f8;
      uStack_23f0 = auVar78._16_8_;
      uStack_1d70 = uStack_23f0;
      uStack_23e8 = auVar78._24_8_;
      uStack_1d68 = uStack_23e8;
      uStack_23e0 = auVar78._32_8_;
      uStack_1d60 = uStack_23e0;
      uStack_23d8 = auVar78._40_8_;
      uStack_1d58 = uStack_23d8;
      uStack_23d0 = auVar78._48_8_;
      uStack_1d50 = uStack_23d0;
      uStack_23c8 = auVar78._56_8_;
      uStack_1d48 = uStack_23c8;
      local_1dc0 = local_2280._0_8_;
      uStack_1db8 = local_2280._8_8_;
      uStack_1db0 = local_2280._16_8_;
      uStack_1da8 = local_2280._24_8_;
      uStack_1da0 = local_2280._32_8_;
      uStack_1d98 = local_2280._40_8_;
      uStack_1d90 = local_2280._48_8_;
      uStack_1d88 = local_2280._56_8_;
      local_1e00[0] = 0.5;
      local_1e00[1] = 0.5;
      afStack_1df8[0] = 0.5;
      afStack_1df8[1] = 0.5;
      afStack_1df0[0] = 0.5;
      afStack_1df0[1] = 0.5;
      afStack_1de8[0] = 0.5;
      afStack_1de8[1] = 0.5;
      afStack_1de0[0] = 0.5;
      afStack_1de0[1] = 0.5;
      afStack_1dd8[0] = 0.5;
      afStack_1dd8[1] = 0.5;
      afStack_1dd0[0] = 0.5;
      afStack_1dd0[1] = 0.5;
      afStack_1dc8[0] = 0.5;
      afStack_1dc8[1] = 0.5;
      auVar81._8_4_ = 0.5;
      auVar81._12_4_ = 0.5;
      auVar81._0_4_ = 0.5;
      auVar81._4_4_ = 0.5;
      auVar81._16_4_ = 0.5;
      auVar81._20_4_ = 0.5;
      auVar81._24_4_ = 0.5;
      auVar81._28_4_ = 0.5;
      auVar81._32_4_ = 0.5;
      auVar81._36_4_ = 0.5;
      auVar81._40_4_ = 0.5;
      auVar81._44_4_ = 0.5;
      auVar81._48_4_ = 0.5;
      auVar81._52_4_ = 0.5;
      auVar81._56_4_ = 0.5;
      auVar81._60_4_ = 0.5;
      auVar78 = vfmadd213ps_avx512f(local_2280,auVar78,auVar81);
      local_2400 = auVar78._0_8_;
      local_1e40 = local_2400;
      uStack_23f8 = auVar78._8_8_;
      uStack_1e38 = uStack_23f8;
      uStack_23f0 = auVar78._16_8_;
      uStack_1e30 = uStack_23f0;
      uStack_23e8 = auVar78._24_8_;
      uStack_1e28 = uStack_23e8;
      uStack_23e0 = auVar78._32_8_;
      uStack_1e20 = uStack_23e0;
      uStack_23d8 = auVar78._40_8_;
      uStack_1e18 = uStack_23d8;
      uStack_23d0 = auVar78._48_8_;
      uStack_1e10 = uStack_23d0;
      uStack_23c8 = auVar78._56_8_;
      uStack_1e08 = uStack_23c8;
      local_1e80 = local_22c0._0_8_;
      uStack_1e78 = local_22c0._8_8_;
      uStack_1e70 = local_22c0._16_8_;
      uStack_1e68 = local_22c0._24_8_;
      uStack_1e60 = local_22c0._32_8_;
      uStack_1e58 = local_22c0._40_8_;
      uStack_1e50 = local_22c0._48_8_;
      uStack_1e48 = local_22c0._56_8_;
      local_1ec0 = local_2280._0_8_;
      uStack_1eb8 = local_2280._8_8_;
      uStack_1eb0 = local_2280._16_8_;
      uStack_1ea8 = local_2280._24_8_;
      uStack_1ea0 = local_2280._32_8_;
      uStack_1e98 = local_2280._40_8_;
      uStack_1e90 = local_2280._48_8_;
      uStack_1e88 = local_2280._56_8_;
      auVar80 = vfmadd213ps_avx512f(local_22c0,auVar78,local_2280);
      local_2400 = auVar80._0_8_;
      local_2100 = local_2400;
      uStack_23f8 = auVar80._8_8_;
      uStack_20f8 = uStack_23f8;
      uStack_23f0 = auVar80._16_8_;
      uStack_20f0 = uStack_23f0;
      uStack_23e8 = auVar80._24_8_;
      uStack_20e8 = uStack_23e8;
      uStack_23e0 = auVar80._32_8_;
      uStack_20e0 = uStack_23e0;
      uStack_23d8 = auVar80._40_8_;
      uStack_20d8 = uStack_23d8;
      uStack_23d0 = auVar80._48_8_;
      uStack_20d0 = uStack_23d0;
      uStack_23c8 = auVar80._56_8_;
      uStack_20c8 = uStack_23c8;
      local_2140[0] = 1.0;
      local_2140[1] = 1.0;
      afStack_2138[0] = 1.0;
      afStack_2138[1] = 1.0;
      afStack_2130[0] = 1.0;
      afStack_2130[1] = 1.0;
      afStack_2128[0] = 1.0;
      afStack_2128[1] = 1.0;
      afStack_2120[0] = 1.0;
      afStack_2120[1] = 1.0;
      afStack_2118[0] = 1.0;
      afStack_2118[1] = 1.0;
      afStack_2110[0] = 1.0;
      afStack_2110[1] = 1.0;
      afStack_2108[0] = 1.0;
      afStack_2108[1] = 1.0;
      auVar78._8_4_ = 1.0;
      auVar78._12_4_ = 1.0;
      auVar78._0_4_ = 1.0;
      auVar78._4_4_ = 1.0;
      auVar78._16_4_ = 1.0;
      auVar78._20_4_ = 1.0;
      auVar78._24_4_ = 1.0;
      auVar78._28_4_ = 1.0;
      auVar78._32_4_ = 1.0;
      auVar78._36_4_ = 1.0;
      auVar78._40_4_ = 1.0;
      auVar78._44_4_ = 1.0;
      auVar78._48_4_ = 1.0;
      auVar78._52_4_ = 1.0;
      auVar78._56_4_ = 1.0;
      auVar78._60_4_ = 1.0;
      auVar80 = vaddps_avx512f(auVar80,auVar78);
      local_1680 = local_2300._0_8_;
      uStack_1678 = local_2300._8_8_;
      uStack_1670 = uStack_22f0;
      uStack_1668 = uStack_22e8;
      uStack_1660 = uStack_22e0;
      uStack_1658 = uStack_22d8;
      uStack_1650 = uStack_22d0;
      uStack_1648 = uStack_22c8;
      auVar38._16_8_ = uStack_22f0;
      auVar38._0_16_ = local_2300;
      auVar38._24_8_ = uStack_22e8;
      auVar38._32_8_ = uStack_22e0;
      auVar38._40_8_ = uStack_22d8;
      auVar38._48_8_ = uStack_22d0;
      auVar38._56_8_ = uStack_22c8;
      auVar78 = vcvttps2dq_avx512f(auVar38);
      local_1500 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar78 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(auVar78);
      auVar81 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_1600 = vmovdqa64_avx512f(auVar78);
      local_1640 = vmovdqa64_avx512f(auVar81);
      auVar78 = vmovdqa64_avx512f(local_1600);
      auVar81 = vmovdqa64_avx512f(local_1640);
      auVar78 = vpaddd_avx512f(auVar78,auVar81);
      auVar78 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(auVar78);
      local_1580 = vmovdqa64_avx512f(auVar78);
      local_1584 = 0x17;
      auVar78 = vmovdqa64_avx512f(local_1580);
      auVar78 = vpslld_avx512f(auVar78,ZEXT416(0x17));
      local_2340 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(local_2340);
      local_1540 = vmovdqa64_avx512f(auVar78);
      auVar78 = vmovdqa64_avx512f(local_1540);
      local_2440 = vmovdqa64_avx512f(auVar78);
      local_2400 = auVar80._0_8_;
      local_2200 = local_2400;
      uStack_23f8 = auVar80._8_8_;
      uStack_21f8 = uStack_23f8;
      uStack_23f0 = auVar80._16_8_;
      uStack_21f0 = uStack_23f0;
      uStack_23e8 = auVar80._24_8_;
      uStack_21e8 = uStack_23e8;
      uStack_23e0 = auVar80._32_8_;
      uStack_21e0 = uStack_23e0;
      uStack_23d8 = auVar80._40_8_;
      uStack_21d8 = uStack_23d8;
      uStack_23d0 = auVar80._48_8_;
      uStack_21d0 = uStack_23d0;
      uStack_23c8 = auVar80._56_8_;
      uStack_21c8 = uStack_23c8;
      local_2240 = local_2440._0_8_;
      uStack_2238 = local_2440._8_8_;
      uStack_2230 = local_2440._16_8_;
      uStack_2228 = local_2440._24_8_;
      uStack_2220 = local_2440._32_8_;
      uStack_2218 = local_2440._40_8_;
      uStack_2210 = local_2440._48_8_;
      uStack_2208 = local_2440._56_8_;
      _local_2400 = vmulps_avx512f(auVar80,local_2440);
      local_24c0 = local_2400;
      uStack_24b8 = uStack_23f8;
      uStack_24b0 = uStack_23f0;
      uStack_24a8 = uStack_23e8;
      uStack_24a0 = uStack_23e0;
      uStack_2498 = uStack_23d8;
      uStack_2490 = uStack_23d0;
      uStack_2488 = uStack_23c8;
      local_2540 = vaddps_avx512f(local_2640,_local_2400);
      auVar78 = vrcp14ps_avx512f(local_2540);
      auVar80 = vmulps_avx512f(local_2640,auVar78);
      auVar81 = vfmsub213ps_avx512f(auVar80,local_2540,local_2640);
      local_2700 = vfnmadd213ps_avx512f(auVar81,auVar78,auVar80);
      local_2740 = local_2880._0_8_;
      uStack_2738 = local_2880._8_8_;
      uStack_2730 = local_2880._16_8_;
      uStack_2728 = local_2880._24_8_;
      uStack_2720 = local_2880._32_8_;
      uStack_2718 = local_2880._40_8_;
      uStack_2710 = local_2880._48_8_;
      uStack_2708 = local_2880._56_8_;
      local_2780 = local_2800._0_8_;
      uStack_2778 = local_2800._8_8_;
      uStack_2770 = local_2800._16_8_;
      uStack_2768 = local_2800._24_8_;
      uStack_2760 = local_2800._32_8_;
      uStack_2758 = local_2800._40_8_;
      uStack_2750 = local_2800._48_8_;
      uStack_2748 = local_2800._56_8_;
      auVar78 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar78 = vpxord_avx512f(local_2800,auVar78);
      auVar78 = vfmadd213ps_avx512f(local_2880,local_2700,auVar78);
      local_2a10 = local_2bc0;
      local_2c80 = auVar78._0_8_;
      local_2a80 = local_2c80;
      uStack_2c78 = auVar78._8_8_;
      uStack_2a78 = uStack_2c78;
      uStack_2c70 = auVar78._16_8_;
      uStack_2a70 = uStack_2c70;
      uStack_2c68 = auVar78._24_8_;
      uStack_2a68 = uStack_2c68;
      uStack_2c60 = auVar78._32_8_;
      uStack_2a60 = uStack_2c60;
      uStack_2c58 = auVar78._40_8_;
      uStack_2a58 = uStack_2c58;
      uStack_2c50 = auVar78._48_8_;
      uStack_2a50 = uStack_2c50;
      uStack_2c48 = auVar78._56_8_;
      uStack_2a48 = uStack_2c48;
      *local_2bc0 = auVar78;
      local_2bc0 = local_2bc0 + 1;
      uStack_2548 = uStack_2a88;
      local_2480 = local_2500;
      uStack_2478 = uStack_24f8;
      uStack_2470 = uStack_24f0;
      uStack_2468 = uStack_24e8;
      uStack_2460 = uStack_24e0;
      uStack_2458 = uStack_24d8;
      uStack_2450 = uStack_24d0;
      uStack_2448 = uStack_24c8;
      _local_2300 = auVar79;
      local_2180 = local_21c0;
      uStack_2178 = uStack_21b8;
      uStack_2170 = uStack_21b0;
      uStack_2168 = uStack_21a8;
      uStack_2160 = uStack_21a0;
      uStack_2158 = uStack_2198;
      uStack_2150 = uStack_2190;
      uStack_2148 = uStack_2188;
      local_18c2 = local_2382;
      local_18c0 = local_1940;
      uStack_18b8 = uStack_1938;
      uStack_18b0 = uStack_1930;
      uStack_18a8 = uStack_1928;
      uStack_18a0 = uStack_1920;
      uStack_1898 = uStack_1918;
      uStack_1890 = uStack_1910;
      uStack_1888 = uStack_1908;
    }
    for (; local_2c18 + 7 < local_2bb0; local_2c18 = local_2c18 + 8) {
      local_2a08 = local_2bc0;
      auVar74 = *(undefined1 (*) [24])*local_2bc0;
      uStack_29a8 = *(undefined8 *)(*local_2bc0 + 0x18);
      local_2ca0 = auVar74._0_8_;
      local_29c0 = local_2ca0;
      uStack_2c98 = auVar74._8_8_;
      uStack_29b8 = uStack_2c98;
      uStack_2c90 = auVar74._16_8_;
      uStack_29b0 = uStack_2c90;
      local_1484 = 0x3f800000;
      local_1320 = 0x3f800000;
      auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
      local_1340 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
      auStack_1330 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
      local_29e0 = local_1340._0_8_;
      uStack_29d8 = local_1340._8_8_;
      uStack_29d0 = auStack_1330._0_8_;
      uStack_29c8 = auStack_1330._8_8_;
      local_1488 = 0x40000000;
      local_12e0 = 0x40000000;
      auVar16 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x20);
      local_1300 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x20);
      auStack_12f0 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x30);
      local_2a00 = local_1300._0_8_;
      uStack_29f8 = local_1300._8_8_;
      uStack_29f0 = auStack_12f0._0_8_;
      uStack_29e8 = auStack_12f0._8_8_;
      uVar21 = local_2ca0;
      uVar23 = uStack_2c98;
      local_13a0._0_4_ = auVar74._0_4_;
      local_13a0._4_4_ = auVar74._4_4_;
      uStack_1398._0_4_ = auVar74._8_4_;
      uStack_1398._4_4_ = auVar74._12_4_;
      uStack_1390._0_4_ = auVar74._16_4_;
      uStack_1390._4_4_ = auVar74._20_4_;
      uStack_1388._0_4_ = (float)uStack_29a8;
      uStack_1388._4_4_ = (undefined4)((ulong)uStack_29a8 >> 0x20);
      uStack_13e4 = uStack_1388._4_4_;
      local_13c0._0_4_ = local_1300._0_4_;
      local_13c0._4_4_ = local_1300._4_4_;
      uStack_13b8._0_4_ = local_1300._8_4_;
      uStack_13b8._4_4_ = local_1300._12_4_;
      uStack_13b0._0_4_ = auStack_12f0._0_4_;
      uStack_13b0._4_4_ = auStack_12f0._4_4_;
      uStack_13a8._0_4_ = auStack_12f0._8_4_;
      local_1400 = (float)local_13a0 * (float)local_13c0;
      fStack_13fc = local_13a0._4_4_ * local_13c0._4_4_;
      fStack_13f8 = (float)uStack_1398 * (float)uStack_13b8;
      fStack_13f4 = uStack_1398._4_4_ * uStack_13b8._4_4_;
      fStack_13f0 = (float)uStack_1390 * (float)uStack_13b0;
      fStack_13ec = uStack_1390._4_4_ * uStack_13b0._4_4_;
      fStack_13e8 = (float)uStack_1388 * (float)uStack_13a8;
      local_13c4 = 0x3f800000;
      local_1360 = 0x3f800000;
      auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
      local_1380 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
      auStack_1370 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
      local_1420._0_4_ = local_1380._0_4_;
      local_12a0 = (float)local_1420;
      local_1420._4_4_ = local_1380._4_4_;
      fStack_129c = local_1420._4_4_;
      uStack_1418._0_4_ = local_1380._8_4_;
      fStack_1298 = (float)uStack_1418;
      uStack_1418._4_4_ = local_1380._12_4_;
      fStack_1294 = uStack_1418._4_4_;
      uStack_1410._0_4_ = auStack_1370._0_4_;
      fStack_1290 = (float)uStack_1410;
      uStack_1410._4_4_ = auStack_1370._4_4_;
      fStack_128c = uStack_1410._4_4_;
      uStack_1408._0_4_ = auStack_1370._8_4_;
      fStack_1288 = (float)uStack_1408;
      uStack_1408._4_4_ = auStack_1370._12_4_;
      fStack_1284 = uStack_1408._4_4_;
      local_fe0 = 0;
      uStack_fd8 = 0;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_1020 = 0;
      uStack_1018 = 0;
      uStack_1010 = 0;
      uStack_1008 = 0;
      local_1040 = CONCAT44(fStack_13fc,local_1400);
      uStack_1038 = CONCAT44(fStack_13f4,fStack_13f8);
      uStack_1030 = CONCAT44(fStack_13ec,fStack_13f0);
      uStack_1028 = CONCAT44(uStack_1388._4_4_,fStack_13e8);
      auVar41._8_8_ = uStack_1038;
      auVar41._0_8_ = local_1040;
      auVar41._16_8_ = uStack_1030;
      auVar41._24_8_ = uStack_1028;
      auVar20 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar41);
      local_1000 = 0;
      uStack_ff8 = 0;
      uStack_ff0 = 0;
      uStack_fe8 = 0;
      local_11e0 = 0x3f800000;
      uStack_11dc = 0x3f800000;
      uStack_11d8 = 0x3f800000;
      uStack_11d4 = 0x3f800000;
      uStack_11d0 = 0x3f800000;
      uStack_11cc = 0x3f800000;
      uStack_11c8 = 0x3f800000;
      uStack_11c4 = 0x3f800000;
      local_1160._0_8_ = auVar20._0_8_;
      local_fa0 = local_1160._0_8_;
      local_1160._8_8_ = auVar20._8_8_;
      uStack_f98 = local_1160._8_8_;
      local_1160._16_8_ = auVar20._16_8_;
      uStack_f90 = local_1160._16_8_;
      local_1160._24_8_ = auVar20._24_8_;
      uStack_f88 = local_1160._24_8_;
      local_fc0 = 0x42b0c0a5;
      uStack_fbc = 0x42b0c0a5;
      uStack_fb8 = 0x42b0c0a5;
      uStack_fb4 = 0x42b0c0a5;
      uStack_fb0 = 0x42b0c0a5;
      uStack_fac = 0x42b0c0a5;
      uStack_fa8 = 0x42b0c0a5;
      uStack_fa4 = 0x42b0c0a5;
      auVar42._8_4_ = 0x42b0c0a5;
      auVar42._0_8_ = 0x42b0c0a542b0c0a5;
      auVar42._12_4_ = 0x42b0c0a5;
      auVar42._16_4_ = 0x42b0c0a5;
      auVar42._20_4_ = 0x42b0c0a5;
      auVar42._24_4_ = 0x42b0c0a5;
      auVar42._28_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar20,auVar42);
      local_1160._0_8_ = auVar20._0_8_;
      local_f60 = local_1160._0_8_;
      local_1160._8_8_ = auVar20._8_8_;
      uStack_f58 = local_1160._8_8_;
      local_1160._16_8_ = auVar20._16_8_;
      uStack_f50 = local_1160._16_8_;
      local_1160._24_8_ = auVar20._24_8_;
      uStack_f48 = local_1160._24_8_;
      local_f80 = 0xc2b0c0a5;
      uStack_f7c = 0xc2b0c0a5;
      uStack_f78 = 0xc2b0c0a5;
      uStack_f74 = 0xc2b0c0a5;
      uStack_f70 = 0xc2b0c0a5;
      uStack_f6c = 0xc2b0c0a5;
      uStack_f68 = 0xc2b0c0a5;
      uStack_f64 = 0xc2b0c0a5;
      auVar43._8_4_ = 0xc2b0c0a5;
      auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._12_4_ = 0xc2b0c0a5;
      auVar43._16_4_ = 0xc2b0c0a5;
      auVar43._20_4_ = 0xc2b0c0a5;
      auVar43._24_4_ = 0xc2b0c0a5;
      auVar43._28_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar20,auVar43);
      local_1160._0_8_ = auVar18._0_8_;
      local_cc0 = local_1160._0_8_;
      local_1160._8_8_ = auVar18._8_8_;
      uStack_cb8 = local_1160._8_8_;
      local_1160._16_8_ = auVar18._16_8_;
      uStack_cb0 = local_1160._16_8_;
      local_1160._24_8_ = auVar18._24_8_;
      uStack_ca8 = local_1160._24_8_;
      local_ce0 = 0x3fb8aa3b;
      uStack_cdc = 0x3fb8aa3b;
      uStack_cd8 = 0x3fb8aa3b;
      uStack_cd4 = 0x3fb8aa3b;
      uStack_cd0 = 0x3fb8aa3b;
      uStack_ccc = 0x3fb8aa3b;
      uStack_cc8 = 0x3fb8aa3b;
      uStack_cc4 = 0x3fb8aa3b;
      local_d00 = 0x3f000000;
      uStack_cfc = 0x3f000000;
      uStack_cf8 = 0x3f000000;
      uStack_cf4 = 0x3f000000;
      uStack_cf0 = 0x3f000000;
      uStack_cec = 0x3f000000;
      uStack_ce8 = 0x3f000000;
      uStack_ce4 = 0x3f000000;
      local_aa0 = local_1160._0_8_;
      uStack_a98 = local_1160._8_8_;
      uStack_a90 = local_1160._16_8_;
      uStack_a88 = local_1160._24_8_;
      local_ac0 = 0x3fb8aa3b3fb8aa3b;
      uStack_ab8 = 0x3fb8aa3b3fb8aa3b;
      uStack_ab0 = 0x3fb8aa3b3fb8aa3b;
      uStack_aa8 = 0x3fb8aa3b3fb8aa3b;
      local_ae0 = 0x3f0000003f000000;
      uStack_ad8 = 0x3f0000003f000000;
      uStack_ad0 = 0x3f0000003f000000;
      uStack_ac8 = 0x3f0000003f000000;
      auVar46._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar46._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar46._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar45._8_8_ = 0x3f0000003f000000;
      auVar45._0_8_ = 0x3f0000003f000000;
      auVar45._16_8_ = 0x3f0000003f000000;
      auVar45._24_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(auVar46,auVar18,auVar45);
      auVar19 = vroundps_avx(ZEXT1632(auVar16),1);
      auVar20 = vcmpps_avx(ZEXT1632(auVar16),auVar19,1);
      local_1200._0_8_ = auVar20._0_8_;
      local_c80 = local_1200._0_8_;
      local_1200._8_8_ = auVar20._8_8_;
      uStack_c78 = local_1200._8_8_;
      local_1200._16_8_ = auVar20._16_8_;
      uStack_c70 = local_1200._16_8_;
      local_1200._24_8_ = auVar20._24_8_;
      uStack_c68 = local_1200._24_8_;
      local_ca0 = 0x3f8000003f800000;
      uStack_c98 = 0x3f8000003f800000;
      uStack_c90 = 0x3f8000003f800000;
      uStack_c88 = 0x3f8000003f800000;
      auVar44._8_8_ = 0x3f8000003f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._16_8_ = 0x3f8000003f800000;
      auVar44._24_8_ = 0x3f8000003f800000;
      local_1200 = vpand_avx2(auVar20,auVar44);
      local_1180 = auVar19._0_8_;
      local_1060 = local_1180;
      uStack_1178 = auVar19._8_8_;
      uStack_1058 = uStack_1178;
      uStack_1170 = auVar19._16_8_;
      uStack_1050 = uStack_1170;
      uStack_1168 = auVar19._24_8_;
      uStack_1048 = uStack_1168;
      local_1080 = local_1200._0_8_;
      uStack_1078 = local_1200._8_8_;
      uStack_1070 = local_1200._16_8_;
      uStack_1068 = local_1200._24_8_;
      local_11a0 = vsubps_avx(auVar19,local_1200);
      local_bc0 = local_11a0._0_8_;
      uStack_bb8 = local_11a0._8_8_;
      uStack_bb0 = local_11a0._16_8_;
      uStack_ba8 = local_11a0._24_8_;
      local_c00 = local_1160._0_8_;
      uStack_bf8 = local_1160._8_8_;
      uStack_bf0 = local_1160._16_8_;
      uStack_be8 = local_1160._24_8_;
      local_be0 = 0x3f318000;
      uStack_bdc = 0x3f318000;
      uStack_bd8 = 0x3f318000;
      uStack_bd4 = 0x3f318000;
      uStack_bd0 = 0x3f318000;
      uStack_bcc = 0x3f318000;
      uStack_bc8 = 0x3f318000;
      uStack_bc4 = 0x3f318000;
      local_800 = local_11a0._0_8_;
      uStack_7f8 = local_11a0._8_8_;
      uStack_7f0 = local_11a0._16_8_;
      uStack_7e8 = local_11a0._24_8_;
      local_820 = 0x3f3180003f318000;
      uStack_818 = 0x3f3180003f318000;
      uStack_810 = 0x3f3180003f318000;
      uStack_808 = 0x3f3180003f318000;
      local_840 = local_1160._0_8_;
      uStack_838 = local_1160._8_8_;
      uStack_830 = local_1160._16_8_;
      uStack_828 = local_1160._24_8_;
      auVar53._8_8_ = 0x3f3180003f318000;
      auVar53._0_8_ = 0x3f3180003f318000;
      auVar53._16_8_ = 0x3f3180003f318000;
      auVar53._24_8_ = 0x3f3180003f318000;
      auVar16 = vfnmadd213ps_fma(auVar53,local_11a0,auVar18);
      local_c20 = local_11a0._0_8_;
      uStack_c18 = local_11a0._8_8_;
      uStack_c10 = local_11a0._16_8_;
      uStack_c08 = local_11a0._24_8_;
      local_1160._0_8_ = auVar16._0_8_;
      local_c60 = local_1160._0_8_;
      local_1160._8_8_ = auVar16._8_8_;
      uStack_c58 = local_1160._8_8_;
      uStack_c50 = 0;
      uStack_c48 = 0;
      local_c40 = 0xb95e8083;
      uStack_c3c = 0xb95e8083;
      uStack_c38 = 0xb95e8083;
      uStack_c34 = 0xb95e8083;
      uStack_c30 = 0xb95e8083;
      uStack_c2c = 0xb95e8083;
      uStack_c28 = 0xb95e8083;
      uStack_c24 = 0xb95e8083;
      local_7a0 = local_11a0._0_8_;
      uStack_798 = local_11a0._8_8_;
      uStack_790 = local_11a0._16_8_;
      uStack_788 = local_11a0._24_8_;
      local_7c0 = 0xb95e8083b95e8083;
      uStack_7b8 = 0xb95e8083b95e8083;
      uStack_7b0 = 0xb95e8083b95e8083;
      uStack_7a8 = 0xb95e8083b95e8083;
      local_7e0 = local_1160._0_8_;
      uStack_7d8 = local_1160._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      auVar54._8_8_ = 0xb95e8083b95e8083;
      auVar54._0_8_ = 0xb95e8083b95e8083;
      auVar54._16_8_ = 0xb95e8083b95e8083;
      auVar54._24_8_ = 0xb95e8083b95e8083;
      auVar22 = vfnmadd213ps_fma(auVar54,local_11a0,ZEXT1632(auVar16));
      local_1160._0_8_ = auVar22._0_8_;
      local_1100 = local_1160._0_8_;
      local_1160._8_8_ = auVar22._8_8_;
      uStack_10f8 = local_1160._8_8_;
      uStack_10f0 = 0;
      uStack_10e8 = 0;
      local_10e0._0_4_ = auVar22._0_4_;
      local_10e0._4_4_ = auVar22._4_4_;
      uStack_10d8._0_4_ = auVar22._8_4_;
      uStack_10d8._4_4_ = auVar22._12_4_;
      local_1180._4_4_ = local_10e0._4_4_ * local_10e0._4_4_;
      local_1180._0_4_ = (float)local_10e0 * (float)local_10e0;
      local_f20 = local_1180;
      uStack_1178._0_4_ = (float)uStack_10d8 * (float)uStack_10d8;
      uStack_1178._4_4_ = uStack_10d8._4_4_ * uStack_10d8._4_4_;
      auVar17 = _local_1180;
      _local_1180 = ZEXT1632(_local_1180);
      auVar42 = _local_1180;
      uStack_1218._0_4_ = 0x39506967;
      local_1220 = (undefined1  [8])0x3950696739506967;
      uStack_1218._4_4_ = 0x39506967;
      uStack_1210._0_4_ = 0x39506967;
      uStack_1210._4_4_ = 0x39506967;
      auVar74 = _local_1220;
      uStack_1208._0_4_ = 0x39506967;
      uStack_1208._4_4_ = 0x39506967;
      auVar20 = _local_1220;
      local_d20 = 0x3950696739506967;
      uStack_d18 = uStack_1218;
      uStack_1210 = auVar74._16_8_;
      uStack_d10 = uStack_1210;
      uStack_1208 = auVar20._24_8_;
      uStack_d08 = uStack_1208;
      local_d40 = local_1160._0_8_;
      uStack_d38 = local_1160._8_8_;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = 0x3ab743ce;
      uStack_d5c = 0x3ab743ce;
      uStack_d58 = 0x3ab743ce;
      uStack_d54 = 0x3ab743ce;
      uStack_d50 = 0x3ab743ce;
      uStack_d4c = 0x3ab743ce;
      uStack_d48 = 0x3ab743ce;
      uStack_d44 = 0x3ab743ce;
      local_a40 = 0x3950696739506967;
      uStack_a38 = uStack_1218;
      uStack_a30 = uStack_1210;
      uStack_a28 = uStack_1208;
      local_a60 = local_1160._0_8_;
      uStack_a58 = local_1160._8_8_;
      uStack_a50 = 0;
      uStack_a48 = 0;
      local_a80 = 0x3ab743ce3ab743ce;
      uStack_a78 = 0x3ab743ce3ab743ce;
      uStack_a70 = 0x3ab743ce3ab743ce;
      uStack_a68 = 0x3ab743ce3ab743ce;
      auVar48._16_8_ = uStack_1210;
      auVar48._0_16_ = _local_1220;
      auVar48._24_8_ = uStack_1208;
      auVar47._8_8_ = 0x3ab743ce3ab743ce;
      auVar47._0_8_ = 0x3ab743ce3ab743ce;
      auVar47._16_8_ = 0x3ab743ce3ab743ce;
      auVar47._24_8_ = 0x3ab743ce3ab743ce;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar48,auVar47);
      local_1220 = auVar16._0_8_;
      local_d80 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uStack_d78 = uStack_1218;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = local_1160._0_8_;
      uStack_d98 = local_1160._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = 0x3c088908;
      uStack_dbc = 0x3c088908;
      uStack_db8 = 0x3c088908;
      uStack_db4 = 0x3c088908;
      uStack_db0 = 0x3c088908;
      uStack_dac = 0x3c088908;
      uStack_da8 = 0x3c088908;
      uStack_da4 = 0x3c088908;
      local_9e0 = local_1220;
      uStack_9d8 = uStack_1218;
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      local_a00 = local_1160._0_8_;
      uStack_9f8 = local_1160._8_8_;
      uStack_9f0 = 0;
      uStack_9e8 = 0;
      local_a20 = 0x3c0889083c088908;
      uStack_a18 = 0x3c0889083c088908;
      uStack_a10 = 0x3c0889083c088908;
      uStack_a08 = 0x3c0889083c088908;
      auVar49._8_8_ = 0x3c0889083c088908;
      auVar49._0_8_ = 0x3c0889083c088908;
      auVar49._16_8_ = 0x3c0889083c088908;
      auVar49._24_8_ = 0x3c0889083c088908;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar49);
      local_1220 = auVar16._0_8_;
      local_de0 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uStack_dd8 = uStack_1218;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_e00 = local_1160._0_8_;
      uStack_df8 = local_1160._8_8_;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = 0x3d2aa9c1;
      uStack_e1c = 0x3d2aa9c1;
      uStack_e18 = 0x3d2aa9c1;
      uStack_e14 = 0x3d2aa9c1;
      uStack_e10 = 0x3d2aa9c1;
      uStack_e0c = 0x3d2aa9c1;
      uStack_e08 = 0x3d2aa9c1;
      uStack_e04 = 0x3d2aa9c1;
      local_980 = local_1220;
      uStack_978 = uStack_1218;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0 = local_1160._0_8_;
      uStack_998 = local_1160._8_8_;
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0 = 0x3d2aa9c13d2aa9c1;
      uStack_9b8 = 0x3d2aa9c13d2aa9c1;
      uStack_9b0 = 0x3d2aa9c13d2aa9c1;
      uStack_9a8 = 0x3d2aa9c13d2aa9c1;
      auVar50._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar50._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar50._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar50._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar50);
      local_1220 = auVar16._0_8_;
      local_e40 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uStack_e38 = uStack_1218;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_e60 = local_1160._0_8_;
      uStack_e58 = local_1160._8_8_;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = 0x3e2aaaaa;
      uStack_e7c = 0x3e2aaaaa;
      uStack_e78 = 0x3e2aaaaa;
      uStack_e74 = 0x3e2aaaaa;
      uStack_e70 = 0x3e2aaaaa;
      uStack_e6c = 0x3e2aaaaa;
      uStack_e68 = 0x3e2aaaaa;
      uStack_e64 = 0x3e2aaaaa;
      local_920 = local_1220;
      uStack_918 = uStack_1218;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = local_1160._0_8_;
      uStack_938 = local_1160._8_8_;
      uStack_930 = 0;
      uStack_928 = 0;
      local_960 = 0x3e2aaaaa3e2aaaaa;
      uStack_958 = 0x3e2aaaaa3e2aaaaa;
      uStack_950 = 0x3e2aaaaa3e2aaaaa;
      uStack_948 = 0x3e2aaaaa3e2aaaaa;
      auVar51._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar51._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar51._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar51);
      local_1220 = auVar16._0_8_;
      local_ea0 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uStack_e98 = uStack_1218;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_ec0 = local_1160._0_8_;
      uStack_eb8 = local_1160._8_8_;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = 0x3f000000;
      uStack_edc = 0x3f000000;
      uStack_ed8 = 0x3f000000;
      uStack_ed4 = 0x3f000000;
      uStack_ed0 = 0x3f000000;
      uStack_ecc = 0x3f000000;
      uStack_ec8 = 0x3f000000;
      uStack_ec4 = 0x3f000000;
      local_8c0 = local_1220;
      uStack_8b8 = uStack_1218;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0 = local_1160._0_8_;
      uStack_8d8 = local_1160._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900 = 0x3f0000003f000000;
      uStack_8f8 = 0x3f0000003f000000;
      uStack_8f0 = 0x3f0000003f000000;
      uStack_8e8 = 0x3f0000003f000000;
      auVar52._8_8_ = 0x3f0000003f000000;
      auVar52._0_8_ = 0x3f0000003f000000;
      auVar52._16_8_ = 0x3f0000003f000000;
      auVar52._24_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar52);
      local_1220 = auVar16._0_8_;
      local_f00 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uStack_ef8 = uStack_1218;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      uStack_1178 = auVar17._8_8_;
      uStack_f18 = uStack_1178;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = local_1160._0_8_;
      uStack_f38 = local_1160._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_860 = local_1220;
      uStack_858 = uStack_1218;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_f20;
      uStack_878 = uStack_1178;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0 = local_1160._0_8_;
      uStack_898 = local_1160._8_8_;
      uStack_890 = 0;
      uStack_888 = 0;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar16),ZEXT1632(auVar22));
      local_1220 = auVar16._0_8_;
      uVar24 = local_1220;
      uStack_1218 = auVar16._8_8_;
      uVar25 = uStack_1218;
      uStack_1090 = 0;
      uStack_1088 = 0;
      local_10c0 = 0x3f8000003f800000;
      uStack_10b8 = 0x3f8000003f800000;
      uStack_10b0 = 0x3f8000003f800000;
      uStack_10a8 = 0x3f8000003f800000;
      local_10a0._0_4_ = auVar16._0_4_;
      local_10a0._4_4_ = auVar16._4_4_;
      uStack_1098._0_4_ = auVar16._8_4_;
      uStack_1098._4_4_ = auVar16._12_4_;
      local_1220._4_4_ = local_10a0._4_4_ + 1.0;
      local_1220._0_4_ = (float)local_10a0 + 1.0;
      uStack_1218._0_4_ = (float)uStack_1098 + 1.0;
      uStack_1218._4_4_ = uStack_1098._4_4_ + 1.0;
      uStack_1210._0_4_ = 0x3f800000;
      uStack_1210._4_4_ = 0x3f800000;
      auVar74 = _local_1220;
      uStack_1208._0_4_ = 0x3f800000;
      uStack_1208._4_4_ = 0x3f800000;
      auVar18 = _local_1220;
      local_ba0._0_4_ = local_11a0._0_4_;
      local_ba0._4_4_ = local_11a0._4_4_;
      uStack_b98._0_4_ = local_11a0._8_4_;
      uStack_b98._4_4_ = local_11a0._12_4_;
      uStack_b90._0_4_ = local_11a0._16_4_;
      uStack_b90._4_4_ = local_11a0._20_4_;
      uStack_b88._0_4_ = local_11a0._24_4_;
      uStack_b88._4_4_ = local_11a0._28_4_;
      local_11c0._4_4_ = (int)local_ba0._4_4_;
      local_11c0._0_4_ = (int)(float)local_ba0;
      local_11c0._8_4_ = (int)(float)uStack_b98;
      local_11c0._12_4_ = (int)uStack_b98._4_4_;
      local_11c0._16_4_ = (int)(float)uStack_b90;
      local_11c0._20_4_ = (int)uStack_b90._4_4_;
      auVar77 = local_11c0._0_24_;
      local_11c0._24_4_ = (int)(float)uStack_b88;
      local_11c0._28_4_ = (int)uStack_b88._4_4_;
      auVar20 = local_11c0;
      local_b60 = local_11c0._0_8_;
      uStack_b58 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar77._16_8_;
      uStack_b50 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar20._24_8_;
      uStack_b48 = local_11c0._24_8_;
      local_b80 = 0x7f0000007f;
      uStack_b78 = 0x7f0000007f;
      uStack_b70 = 0x7f0000007f;
      uStack_b68 = 0x7f0000007f;
      local_760 = local_11c0._0_8_;
      uStack_758 = local_11c0._8_8_;
      uStack_750 = local_11c0._16_8_;
      uStack_748 = local_11c0._24_8_;
      local_780 = 0x7f0000007f;
      uStack_778 = 0x7f0000007f;
      uStack_770 = 0x7f0000007f;
      uStack_768 = 0x7f0000007f;
      auVar56._16_8_ = local_11c0._16_8_;
      auVar56._0_16_ = local_11c0._0_16_;
      auVar56._24_8_ = local_11c0._24_8_;
      auVar55._8_8_ = 0x7f0000007f;
      auVar55._0_8_ = 0x7f0000007f;
      auVar55._16_8_ = 0x7f0000007f;
      auVar55._24_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx2(auVar56,auVar55);
      local_11c0._0_8_ = auVar20._0_8_;
      local_b20 = local_11c0._0_8_;
      local_11c0._8_8_ = auVar20._8_8_;
      uStack_b18 = local_11c0._8_8_;
      local_11c0._16_8_ = auVar20._16_8_;
      uStack_b10 = local_11c0._16_8_;
      local_11c0._24_8_ = auVar20._24_8_;
      uStack_b08 = local_11c0._24_8_;
      local_b24 = 0x17;
      local_720 = local_11c0._0_8_;
      uStack_718 = local_11c0._8_8_;
      uStack_710 = local_11c0._16_8_;
      uStack_708 = local_11c0._24_8_;
      local_724 = 0x17;
      local_11c0 = vpslld_avx2(auVar20,ZEXT416(0x17));
      local_b00 = local_11c0._0_8_;
      uStack_af8 = local_11c0._8_8_;
      uStack_af0 = local_11c0._16_8_;
      uStack_ae8 = local_11c0._24_8_;
      local_1240 = local_11c0._0_8_;
      uStack_1238 = local_11c0._8_8_;
      uStack_1230 = local_11c0._16_8_;
      uStack_1228 = local_11c0._24_8_;
      local_1120 = local_1220;
      uStack_1118 = uStack_1218;
      uStack_1210 = auVar74._16_8_;
      uStack_1110 = uStack_1210;
      uStack_1208 = auVar18._24_8_;
      uStack_1108 = uStack_1208;
      local_1140._0_4_ = local_11c0._0_4_;
      local_1140._4_4_ = local_11c0._4_4_;
      uStack_1138._0_4_ = local_11c0._8_4_;
      uStack_1138._4_4_ = local_11c0._12_4_;
      uStack_1130._0_4_ = local_11c0._16_4_;
      uStack_1130._4_4_ = local_11c0._20_4_;
      uStack_1128._0_4_ = local_11c0._24_4_;
      local_1220._0_4_ = ((float)local_10a0 + 1.0) * (float)local_1140;
      local_1220._4_4_ = (local_10a0._4_4_ + 1.0) * local_1140._4_4_;
      uStack_1138._0_4_ = ((float)uStack_1098 + 1.0) * (float)uStack_1138;
      uStack_1138._4_4_ = (uStack_1098._4_4_ + 1.0) * uStack_1138._4_4_;
      uStack_1218._0_4_ = (float)uStack_1138;
      uStack_1218._4_4_ = uStack_1138._4_4_;
      uStack_1210._0_4_ = (float)uStack_1130 * 1.0;
      uStack_1210._4_4_ = uStack_1130._4_4_ * 1.0;
      auVar74 = _local_1220;
      uStack_1208._0_4_ = (float)uStack_1128 * 1.0;
      uStack_1208._4_4_ = 0x3f800000;
      auVar41 = _local_1220;
      local_1280 = local_1220;
      uStack_1278 = uStack_1218;
      uStack_1210 = auVar74._16_8_;
      uStack_1270 = uStack_1210;
      uStack_1208 = auVar41._24_8_;
      uStack_1268 = uStack_1208;
      local_12c0 = (float)local_1420 + (float)local_1220._0_4_;
      fStack_12bc = local_1420._4_4_ + (float)local_1220._4_4_;
      fStack_12b8 = (float)uStack_1418 + (float)uStack_1138;
      fStack_12b4 = uStack_1418._4_4_ + uStack_1138._4_4_;
      fStack_12b0 = (float)uStack_1410 + (float)uStack_1130 * 1.0;
      fStack_12ac = uStack_1410._4_4_ + uStack_1130._4_4_ * 1.0;
      fStack_12a8 = (float)uStack_1408 + (float)uStack_1128 * 1.0;
      fStack_12a4 = uStack_1408._4_4_ + 1.0;
      auVar40._16_4_ = (float)uStack_1410;
      auVar40._0_16_ = local_1380;
      auVar40._20_4_ = uStack_1410._4_4_;
      auVar40._24_4_ = (float)uStack_1408;
      auVar40._28_4_ = uStack_1408._4_4_;
      auVar39._4_4_ = fStack_12bc;
      auVar39._0_4_ = local_12c0;
      auVar39._8_4_ = fStack_12b8;
      auVar39._12_4_ = fStack_12b4;
      auVar39._16_4_ = fStack_12b0;
      auVar39._20_4_ = fStack_12ac;
      auVar39._24_4_ = fStack_12a8;
      auVar39._28_4_ = fStack_12a4;
      auVar20 = vrcpps_avx(auVar39);
      auVar18._4_4_ = local_1420._4_4_ * auVar20._4_4_;
      auVar18._0_4_ = (float)local_1420 * auVar20._0_4_;
      auVar18._8_4_ = (float)uStack_1418 * auVar20._8_4_;
      auVar18._12_4_ = uStack_1418._4_4_ * auVar20._12_4_;
      auVar18._16_4_ = (float)uStack_1410 * auVar20._16_4_;
      auVar18._20_4_ = uStack_1410._4_4_ * auVar20._20_4_;
      auVar18._24_4_ = (float)uStack_1408 * auVar20._24_4_;
      auVar18._28_4_ = uStack_1408._4_4_;
      auVar16 = vfmsub213ps_fma(auVar18,auVar39,auVar40);
      auVar16 = vfnmadd213ps_fma(ZEXT1632(auVar16),auVar20,auVar18);
      local_1460 = local_1300._0_8_;
      uStack_1458 = local_1300._8_8_;
      uStack_1450 = auStack_12f0._0_8_;
      uStack_1448 = auStack_12f0._8_8_;
      local_1480 = local_1340._0_8_;
      uStack_1478 = local_1340._8_8_;
      uStack_1470 = auStack_1330._0_8_;
      uStack_1468 = auStack_1330._8_8_;
      local_1440 = ZEXT1632(auVar16);
      auVar19._16_8_ = auStack_12f0._0_8_;
      auVar19._0_16_ = local_1300;
      auVar19._24_8_ = auStack_12f0._8_8_;
      auVar20._16_8_ = auStack_1330._0_8_;
      auVar20._0_16_ = local_1340;
      auVar20._24_8_ = auStack_1330._8_8_;
      auVar83._8_4_ = 0x80000000;
      auVar83._0_8_ = 0x8000000080000000;
      auVar83._12_4_ = 0x80000000;
      auVar83._16_4_ = 0x80000000;
      auVar83._20_4_ = 0x80000000;
      auVar83._24_4_ = 0x80000000;
      auVar83._28_4_ = 0x80000000;
      auVar16 = vfmadd213ps_fma(auVar19,local_1440,auVar20 ^ auVar83);
      local_2970 = local_2bc0;
      local_2ca0 = auVar16._0_8_;
      local_29a0 = local_2ca0;
      uStack_2c98 = auVar16._8_8_;
      uStack_2998 = uStack_2c98;
      uStack_2990 = 0;
      uStack_2988 = 0;
      *(undefined1 (*) [32])*local_2bc0 = ZEXT1632(auVar16);
      local_2bc0 = (undefined1 (*) [64])(*local_2bc0 + 0x20);
      local_1420 = local_1380._0_8_;
      uStack_1418 = local_1380._8_8_;
      uStack_1410 = auStack_1370._0_8_;
      uStack_1408 = auStack_1370._8_8_;
      local_13c0 = local_1300._0_8_;
      uStack_13b8 = local_1300._8_8_;
      uStack_13b0 = auStack_12f0._0_8_;
      uStack_13a8 = auStack_12f0._8_8_;
      local_13a0 = uVar21;
      uStack_1398 = uVar23;
      uStack_1390 = uStack_2c90;
      uStack_1388 = uStack_29a8;
      local_135c = local_1360;
      local_1358 = local_1360;
      local_1354 = local_1360;
      local_1350 = local_1360;
      local_134c = local_1360;
      local_1348 = local_1360;
      local_1344 = local_1360;
      local_131c = local_1320;
      local_1318 = local_1320;
      local_1314 = local_1320;
      local_1310 = local_1320;
      local_130c = local_1320;
      local_1308 = local_1320;
      local_1304 = local_1320;
      local_12dc = local_12e0;
      local_12d8 = local_12e0;
      local_12d4 = local_12e0;
      local_12d0 = local_12e0;
      local_12cc = local_12e0;
      local_12c8 = local_12e0;
      local_12c4 = local_12e0;
      local_1260 = local_12a0;
      fStack_125c = fStack_129c;
      fStack_1258 = fStack_1298;
      fStack_1254 = fStack_1294;
      fStack_1250 = fStack_1290;
      fStack_124c = fStack_128c;
      fStack_1248 = fStack_1288;
      fStack_1244 = fStack_1284;
      _local_1220 = auVar41;
      _local_1180 = auVar42;
      local_1160 = ZEXT1632(auVar22);
      local_1140 = local_11c0._0_8_;
      uStack_1138 = local_11c0._8_8_;
      uStack_1130 = local_11c0._16_8_;
      uStack_1128 = local_11c0._24_8_;
      local_10e0 = local_1100;
      uStack_10d8 = uStack_10f8;
      uStack_10d0 = uStack_10f0;
      uStack_10c8 = uStack_10e8;
      local_10a0 = uVar24;
      uStack_1098 = uVar25;
      local_ba0 = local_11a0._0_8_;
      uStack_b98 = local_11a0._8_8_;
      uStack_b90 = local_11a0._16_8_;
      uStack_b88 = local_11a0._24_8_;
    }
    for (; local_28b0 = local_2b58, local_2be8 = local_2910, local_2c18 + 3 < local_2bb0;
        local_2c18 = local_2c18 + 4) {
      local_2968 = local_2bc0;
      local_2940 = *(undefined8 *)*local_2bc0;
      uStack_2938 = *(undefined8 *)(*local_2bc0 + 8);
      local_6b4 = 0x3f800000;
      local_6d0 = 0x3f800000;
      local_2950 = 0x3f8000003f800000;
      uStack_2948 = 0x3f8000003f800000;
      local_6d4 = 0x40000000;
      local_6f0 = 0x40000000;
      local_2960 = 0x4000000040000000;
      uStack_2958 = 0x4000000040000000;
      local_660._0_4_ = (float)local_2940;
      local_660._4_4_ = (float)((ulong)local_2940 >> 0x20);
      uStack_658._0_4_ = (float)uStack_2938;
      uStack_658._4_4_ = (float)((ulong)uStack_2938 >> 0x20);
      local_640 = (float)local_660 * 2.0;
      fStack_63c = local_660._4_4_ * 2.0;
      fStack_638 = (float)uStack_658 * 2.0;
      fStack_634 = uStack_658._4_4_ * 2.0;
      local_614 = 0x3f800000;
      local_630 = 0x3f800000;
      local_650 = 0x3f8000003f800000;
      uStack_648 = 0x3f8000003f800000;
      local_5e0._8_8_ = 0x3f8000003f800000;
      local_5e0._0_8_ = 0x3f8000003f800000;
      local_460 = (undefined1  [16])0x0;
      local_600 = 0;
      uStack_5f8 = 0;
      local_610 = CONCAT44(fStack_63c,local_640);
      uStack_608 = CONCAT44(fStack_634,fStack_638);
      auVar22._8_8_ = uStack_608;
      auVar22._0_8_ = local_610;
      auVar16 = vsubps_avx(ZEXT816(0),auVar22);
      local_470 = (undefined1  [16])0x0;
      local_580 = 0x3f800000;
      uStack_57c = 0x3f800000;
      uStack_578 = 0x3f800000;
      uStack_574 = 0x3f800000;
      local_540._0_8_ = auVar16._0_8_;
      local_440 = local_540._0_8_;
      local_540._8_8_ = auVar16._8_8_;
      uStack_438 = local_540._8_8_;
      local_450 = 0x42b0c0a5;
      uStack_44c = 0x42b0c0a5;
      uStack_448 = 0x42b0c0a5;
      uStack_444 = 0x42b0c0a5;
      auVar57._8_4_ = 0x42b0c0a5;
      auVar57._0_8_ = 0x42b0c0a542b0c0a5;
      auVar57._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar57);
      local_540._0_8_ = auVar16._0_8_;
      local_420 = local_540._0_8_;
      local_540._8_8_ = auVar16._8_8_;
      uStack_418 = local_540._8_8_;
      local_430 = 0xc2b0c0a5;
      uStack_42c = 0xc2b0c0a5;
      uStack_428 = 0xc2b0c0a5;
      uStack_424 = 0xc2b0c0a5;
      auVar58._8_4_ = 0xc2b0c0a5;
      auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar58._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar16,auVar58);
      local_540._0_8_ = auVar17._0_8_;
      uVar21 = local_540._0_8_;
      local_540._8_8_ = auVar17._8_8_;
      uVar23 = local_540._8_8_;
      local_4d0 = 0x3fb8aa3b;
      uStack_4cc = 0x3fb8aa3b;
      uStack_4c8 = 0x3fb8aa3b;
      uStack_4c4 = 0x3fb8aa3b;
      local_4c0._0_4_ = auVar17._0_4_;
      local_4c0._4_4_ = auVar17._4_4_;
      uStack_4b8._0_4_ = auVar17._8_4_;
      uStack_4b8._4_4_ = auVar17._12_4_;
      local_560._4_4_ = local_4c0._4_4_ * 1.442695;
      local_560._0_4_ = (float)local_4c0 * 1.442695;
      uStack_558._0_4_ = (float)uStack_4b8 * 1.442695;
      uStack_558._4_4_ = uStack_4b8._4_4_ * 1.442695;
      local_480 = local_560;
      uStack_478 = uStack_558;
      local_490 = 0x3f000000;
      uStack_48c = 0x3f000000;
      uStack_488 = 0x3f000000;
      uStack_484 = 0x3f000000;
      local_560._0_4_ = (float)local_4c0 * 1.442695 + 0.5;
      local_560._4_4_ = local_4c0._4_4_ * 1.442695 + 0.5;
      fVar84 = (float)uStack_4b8 * 1.442695 + 0.5;
      fVar85 = uStack_4b8._4_4_ * 1.442695 + 0.5;
      uStack_558._0_4_ = fVar84;
      uStack_558._4_4_ = fVar85;
      local_400 = local_560;
      uStack_3f8 = uStack_558;
      local_570._4_4_ = (int)(float)local_560._4_4_;
      local_570._0_4_ = (int)(float)local_560._0_4_;
      local_570._8_4_ = (int)fVar84;
      local_570._12_4_ = (int)fVar85;
      local_3f0 = local_570._0_8_;
      uStack_3e8 = local_570._8_8_;
      auVar59._8_8_ = local_570._8_8_;
      auVar59._0_8_ = local_570._0_8_;
      auVar22 = vcvtdq2ps_avx(auVar59);
      local_550 = auVar22._0_8_;
      local_3d0 = local_550;
      uStack_548 = auVar22._8_8_;
      uStack_3c8 = uStack_548;
      local_3e0 = local_560;
      uStack_3d8 = uStack_558;
      auVar60._8_8_ = uStack_558;
      auVar60._0_8_ = local_560;
      auVar16 = vcmpps_avx(auVar60,auVar22,1);
      local_590._0_8_ = auVar16._0_8_;
      local_3b0 = local_590._0_8_;
      local_590._8_8_ = auVar16._8_8_;
      uStack_3a8 = local_590._8_8_;
      local_3c0 = 0x3f8000003f800000;
      uStack_3b8 = 0x3f8000003f800000;
      auVar61._8_8_ = 0x3f8000003f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      local_590 = vpand_avx(auVar16,auVar61);
      local_520 = local_550;
      uStack_518 = uStack_548;
      local_530 = local_590._0_8_;
      uStack_528 = local_590._8_8_;
      _local_560 = vsubps_avx(auVar22,local_590);
      local_350 = local_560;
      uStack_348 = uStack_558;
      local_370 = local_540._0_8_;
      uStack_368 = local_540._8_8_;
      local_360 = 0x3f318000;
      uStack_35c = 0x3f318000;
      uStack_358 = 0x3f318000;
      uStack_354 = 0x3f318000;
      local_1b0 = local_560;
      uStack_1a8 = uStack_558;
      local_1c0 = 0x3f3180003f318000;
      uStack_1b8 = 0x3f3180003f318000;
      local_1d0 = local_540._0_8_;
      uStack_1c8 = local_540._8_8_;
      auVar64._8_8_ = 0x3f3180003f318000;
      auVar64._0_8_ = 0x3f3180003f318000;
      auVar16 = vfnmadd213ps_fma(auVar64,_local_560,auVar17);
      local_380 = local_560;
      uStack_378 = uStack_558;
      local_540._0_8_ = auVar16._0_8_;
      local_3a0 = local_540._0_8_;
      local_540._8_8_ = auVar16._8_8_;
      uStack_398 = local_540._8_8_;
      local_390 = 0xb95e8083;
      uStack_38c = 0xb95e8083;
      uStack_388 = 0xb95e8083;
      uStack_384 = 0xb95e8083;
      local_180 = local_560;
      uStack_178 = uStack_558;
      local_190 = 0xb95e8083b95e8083;
      uStack_188 = 0xb95e8083b95e8083;
      local_1a0 = local_540._0_8_;
      uStack_198 = local_540._8_8_;
      auVar65._8_8_ = 0xb95e8083b95e8083;
      auVar65._0_8_ = 0xb95e8083b95e8083;
      local_540 = vfnmadd213ps_fma(auVar65,_local_560,auVar16);
      local_4f0 = local_540._0_8_;
      uStack_4e8 = local_540._8_8_;
      local_4e0._0_4_ = local_540._0_4_;
      local_4e0._4_4_ = local_540._4_4_;
      uStack_4d8._0_4_ = local_540._8_4_;
      uStack_4d8._4_4_ = local_540._12_4_;
      local_550 = CONCAT44(local_4e0._4_4_ * local_4e0._4_4_,(float)local_4e0 * (float)local_4e0);
      uStack_548._0_4_ = (float)uStack_4d8 * (float)uStack_4d8;
      uStack_548._4_4_ = uStack_4d8._4_4_ * uStack_4d8._4_4_;
      uStack_598._0_4_ = 0x39506967;
      local_5a0 = (undefined1  [8])0x3950696739506967;
      uStack_598._4_4_ = 0x39506967;
      local_230 = 0x3950696739506967;
      uStack_228 = uStack_598;
      local_240 = local_540._0_8_;
      uStack_238 = local_540._8_8_;
      local_250 = 0x3ab743ce;
      uStack_24c = 0x3ab743ce;
      uStack_248 = 0x3ab743ce;
      uStack_244 = 0x3ab743ce;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_598;
      local_160 = local_540._0_8_;
      uStack_158 = local_540._8_8_;
      local_170 = 0x3ab743ce3ab743ce;
      uStack_168 = 0x3ab743ce3ab743ce;
      auVar67._8_8_ = uStack_598;
      auVar67._0_8_ = 0x3950696739506967;
      auVar66._8_8_ = 0x3ab743ce3ab743ce;
      auVar66._0_8_ = 0x3ab743ce3ab743ce;
      auVar16 = vfmadd213ps_fma(local_540,auVar67,auVar66);
      local_5a0 = auVar16._0_8_;
      local_260 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uStack_258 = uStack_598;
      local_270 = local_540._0_8_;
      uStack_268 = local_540._8_8_;
      local_280 = 0x3c088908;
      uStack_27c = 0x3c088908;
      uStack_278 = 0x3c088908;
      uStack_274 = 0x3c088908;
      local_120 = local_5a0;
      uStack_118 = uStack_598;
      local_130 = local_540._0_8_;
      uStack_128 = local_540._8_8_;
      local_140 = 0x3c0889083c088908;
      uStack_138 = 0x3c0889083c088908;
      auVar68._8_8_ = 0x3c0889083c088908;
      auVar68._0_8_ = 0x3c0889083c088908;
      auVar16 = vfmadd213ps_fma(local_540,auVar16,auVar68);
      local_5a0 = auVar16._0_8_;
      local_290 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uStack_288 = uStack_598;
      local_2a0 = local_540._0_8_;
      uStack_298 = local_540._8_8_;
      local_2b0 = 0x3d2aa9c1;
      uStack_2ac = 0x3d2aa9c1;
      uStack_2a8 = 0x3d2aa9c1;
      uStack_2a4 = 0x3d2aa9c1;
      local_f0 = local_5a0;
      uStack_e8 = uStack_598;
      local_100 = local_540._0_8_;
      uStack_f8 = local_540._8_8_;
      local_110 = 0x3d2aa9c13d2aa9c1;
      uStack_108 = 0x3d2aa9c13d2aa9c1;
      auVar69._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16 = vfmadd213ps_fma(local_540,auVar16,auVar69);
      local_5a0 = auVar16._0_8_;
      local_2c0 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uStack_2b8 = uStack_598;
      local_2d0 = local_540._0_8_;
      uStack_2c8 = local_540._8_8_;
      local_2e0 = 0x3e2aaaaa;
      uStack_2dc = 0x3e2aaaaa;
      uStack_2d8 = 0x3e2aaaaa;
      uStack_2d4 = 0x3e2aaaaa;
      local_c0 = local_5a0;
      uStack_b8 = uStack_598;
      local_d0 = local_540._0_8_;
      uStack_c8 = local_540._8_8_;
      local_e0 = 0x3e2aaaaa3e2aaaaa;
      uStack_d8 = 0x3e2aaaaa3e2aaaaa;
      auVar70._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar70._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16 = vfmadd213ps_fma(local_540,auVar16,auVar70);
      local_5a0 = auVar16._0_8_;
      local_2f0 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uStack_2e8 = uStack_598;
      local_300 = local_540._0_8_;
      uStack_2f8 = local_540._8_8_;
      local_310 = 0x3f000000;
      uStack_30c = 0x3f000000;
      uStack_308 = 0x3f000000;
      uStack_304 = 0x3f000000;
      local_90 = local_5a0;
      uStack_88 = uStack_598;
      local_a0 = local_540._0_8_;
      uStack_98 = local_540._8_8_;
      local_b0 = 0x3f0000003f000000;
      uStack_a8 = 0x3f0000003f000000;
      auVar71._8_8_ = 0x3f0000003f000000;
      auVar71._0_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(local_540,auVar16,auVar71);
      local_5a0 = auVar16._0_8_;
      local_320 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uStack_318 = uStack_598;
      local_330 = local_550;
      uStack_328 = uStack_548;
      local_340 = local_540._0_8_;
      uStack_338 = local_540._8_8_;
      local_60 = local_5a0;
      uStack_58 = uStack_598;
      local_70 = local_550;
      uStack_68 = uStack_548;
      local_80 = local_540._0_8_;
      uStack_78 = local_540._8_8_;
      auVar72._8_8_ = uStack_548;
      auVar72._0_8_ = local_550;
      auVar16 = vfmadd213ps_fma(auVar72,auVar16,local_540);
      local_5a0 = auVar16._0_8_;
      uVar24 = local_5a0;
      uStack_598 = auVar16._8_8_;
      uVar25 = uStack_598;
      local_4b0 = 0x3f8000003f800000;
      uStack_4a8 = 0x3f8000003f800000;
      local_4a0._0_4_ = auVar16._0_4_;
      local_4a0._4_4_ = auVar16._4_4_;
      uStack_498._0_4_ = auVar16._8_4_;
      uStack_498._4_4_ = auVar16._12_4_;
      local_5a0._4_4_ = local_4a0._4_4_ + 1.0;
      local_5a0._0_4_ = (float)local_4a0 + 1.0;
      uStack_598._0_4_ = (float)uStack_498 + 1.0;
      uStack_598._4_4_ = uStack_498._4_4_ + 1.0;
      local_410._0_4_ = local_560._0_4_;
      local_410._4_4_ = local_560._4_4_;
      uStack_408._0_4_ = local_560._8_4_;
      uStack_408._4_4_ = local_560._12_4_;
      local_570._4_4_ = (int)local_410._4_4_;
      local_570._0_4_ = (int)(float)local_410;
      local_570._8_4_ = (int)(float)uStack_408;
      local_570._12_4_ = (int)uStack_408._4_4_;
      local_210 = local_570._0_8_;
      uStack_208 = local_570._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar63._8_8_ = local_570._8_8_;
      auVar63._0_8_ = local_570._0_8_;
      auVar62._8_8_ = 0x7f0000007f;
      auVar62._0_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx(auVar63,auVar62);
      local_570._0_8_ = auVar16._0_8_;
      local_1f0 = local_570._0_8_;
      local_570._8_8_ = auVar16._8_8_;
      uStack_1e8 = local_570._8_8_;
      local_1f4 = 0x17;
      local_570 = vpslld_avx(auVar16,ZEXT416(0x17));
      local_1e0 = local_570._0_8_;
      uStack_1d8 = local_570._8_8_;
      local_5b0 = local_570._0_8_;
      uStack_5a8 = local_570._8_8_;
      local_500 = _local_5a0;
      local_510._0_4_ = local_570._0_4_;
      local_510._4_4_ = local_570._4_4_;
      uStack_508._0_4_ = local_570._8_4_;
      uStack_508._4_4_ = local_570._12_4_;
      local_5a0._0_4_ = ((float)local_4a0 + 1.0) * (float)local_510;
      local_5a0._4_4_ = (local_4a0._4_4_ + 1.0) * local_510._4_4_;
      uStack_508._0_4_ = ((float)uStack_498 + 1.0) * (float)uStack_508;
      uStack_508._4_4_ = (uStack_498._4_4_ + 1.0) * uStack_508._4_4_;
      uStack_598._0_4_ = (float)uStack_508;
      uStack_598._4_4_ = uStack_508._4_4_;
      local_5d0 = local_5a0;
      uStack_5c8 = uStack_598;
      local_5f0 = (float)local_5a0._0_4_ + 1.0;
      fStack_5ec = (float)local_5a0._4_4_ + 1.0;
      fStack_5e8 = (float)uStack_508 + 1.0;
      fStack_5e4 = uStack_508._4_4_ + 1.0;
      auVar17._4_4_ = fStack_5ec;
      auVar17._0_4_ = local_5f0;
      auVar17._8_4_ = fStack_5e8;
      auVar17._12_4_ = fStack_5e4;
      _local_680 = vdivps_avx(local_5e0,auVar17);
      local_6a0._0_4_ = (float)local_680._0_4_ * 2.0;
      local_6a0._4_4_ = (float)local_680._4_4_ * 2.0;
      local_6a0._8_4_ = fStack_678 * 2.0;
      local_6a0._12_4_ = fStack_674 * 2.0;
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16 = vsubps_avx(local_6a0,auVar16);
      local_2918 = local_2bc0;
      local_2cb0 = auVar16._0_8_;
      local_2930 = local_2cb0;
      uStack_2ca8 = auVar16._8_8_;
      uStack_2928 = uStack_2ca8;
      *(undefined1 (*) [16])*local_2bc0 = auVar16;
      local_2bc0 = (undefined1 (*) [64])(*local_2bc0 + 0x10);
      uStack_6ec = local_6f0;
      uStack_6e8 = local_6f0;
      uStack_6e4 = local_6f0;
      uStack_6cc = local_6d0;
      uStack_6c8 = local_6d0;
      uStack_6c4 = local_6d0;
      local_6b0 = local_2950;
      uStack_6a8 = uStack_2948;
      local_690 = local_2960;
      uStack_688 = uStack_2958;
      local_670 = local_2960;
      uStack_668 = uStack_2958;
      local_660 = local_2940;
      uStack_658 = uStack_2938;
      uStack_62c = local_630;
      uStack_628 = local_630;
      uStack_624 = local_630;
      local_5c0 = local_5e0;
      local_510 = local_570._0_8_;
      uStack_508 = local_570._8_8_;
      local_4e0 = local_4f0;
      uStack_4d8 = uStack_4e8;
      local_4c0 = uVar21;
      uStack_4b8 = uVar23;
      local_4a0 = uVar24;
      uStack_498 = uVar25;
      local_410 = local_560;
      uStack_408 = uStack_558;
    }
    for (; local_2c18 < local_2bb0; local_2c18 = local_2c18 + 1) {
      dVar82 = std::tanh((double)(ulong)*(uint *)*local_2bc0);
      *(int *)*local_2bc0 = SUB84(dVar82,0);
      local_2bc0 = (undefined1 (*) [64])(*local_2bc0 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}